

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  Geometry *pGVar1;
  long lVar2;
  long lVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  ulong uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  size_t k;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  uint uVar44;
  uint uVar45;
  AABBNodeMB4D *node1;
  ulong uVar46;
  undefined4 uVar48;
  ushort uVar49;
  undefined1 (*pauVar50) [64];
  long lVar51;
  uint uVar52;
  ulong uVar53;
  QuadMesh *mesh;
  NodeRef root;
  ulong *puVar54;
  bool bVar55;
  ulong uVar56;
  ulong uVar57;
  int iVar58;
  undefined1 auVar62 [32];
  int iVar108;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar106;
  int iVar107;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  int iVar112;
  int iVar120;
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar121 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM25 [64];
  vuint<4> *v;
  Precalculations pre;
  vint<16> itime;
  Vec3<embree::vfloat_impl<16>_> p1;
  Vec3<embree::vfloat_impl<16>_> p0;
  TravRayK<16,_true> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a864;
  ushort local_a84c;
  Precalculations local_a829;
  ulong local_a828;
  ulong local_a820;
  BVH *local_a818;
  RayK<16> *local_a810;
  uint local_a804;
  undefined1 local_a800 [16];
  RTCRayQueryContext *pRStack_a7f0;
  RayK<16> *pRStack_a7e8;
  undefined1 *puStack_a7e0;
  undefined4 uStack_a7d8;
  undefined1 auStack_a7d4 [20];
  Intersectors *local_a7a0;
  undefined1 (*local_a798) [32];
  ulong local_a790;
  ulong local_a788;
  undefined1 local_a780 [64];
  undefined1 local_a740 [64];
  undefined1 local_a700 [64];
  undefined1 local_a6c0 [64];
  undefined1 local_a680 [64];
  undefined1 local_a640 [64];
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [64];
  undefined1 local_a440 [64];
  undefined1 local_a400 [64];
  undefined1 local_a3c0 [64];
  undefined1 local_a380 [64];
  undefined1 local_a340 [64];
  undefined1 local_a300 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a2c0;
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  undefined1 local_a0c0 [64];
  undefined1 local_a080 [64];
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  uint local_9fc0;
  uint uStack_9fbc;
  uint uStack_9fb8;
  uint uStack_9fb4;
  uint uStack_9fb0;
  uint uStack_9fac;
  uint uStack_9fa8;
  uint uStack_9fa4;
  uint uStack_9fa0;
  uint uStack_9f9c;
  uint uStack_9f98;
  uint uStack_9f94;
  uint uStack_9f90;
  uint uStack_9f8c;
  uint uStack_9f88;
  uint uStack_9f84;
  uint local_9f80;
  uint uStack_9f7c;
  uint uStack_9f78;
  uint uStack_9f74;
  uint uStack_9f70;
  uint uStack_9f6c;
  uint uStack_9f68;
  uint uStack_9f64;
  uint uStack_9f60;
  uint uStack_9f5c;
  uint uStack_9f58;
  uint uStack_9f54;
  uint uStack_9f50;
  uint uStack_9f4c;
  uint uStack_9f48;
  uint uStack_9f44;
  undefined1 local_9f40 [64];
  undefined1 local_9f00 [64];
  undefined1 local_9ec0 [64];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  ulong uVar47;
  undefined1 auVar102 [64];
  
  local_a818 = (BVH *)This->ptr;
  if ((local_a818->root).ptr != 8) {
    auVar63 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar56 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar121,5);
    uVar47 = vpcmpeqd_avx512f(auVar63,(undefined1  [64])valid_i->field_0);
    uVar56 = uVar56 & uVar47;
    if ((ushort)uVar56 != 0) {
      local_a2c0._0_8_ = *(undefined8 *)ray;
      local_a2c0._8_8_ = *(undefined8 *)(ray + 8);
      local_a2c0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_a2c0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_a2c0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_a2c0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_a2c0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_a2c0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_a2c0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_a2c0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_a2c0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_a2c0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_a2c0._96_8_ = *(undefined8 *)(ray + 0x60);
      local_a2c0._104_8_ = *(undefined8 *)(ray + 0x68);
      local_a2c0._112_8_ = *(undefined8 *)(ray + 0x70);
      local_a2c0._120_8_ = *(undefined8 *)(ray + 0x78);
      local_a2c0._128_8_ = *(undefined8 *)(ray + 0x80);
      local_a2c0._136_8_ = *(undefined8 *)(ray + 0x88);
      local_a2c0._144_8_ = *(undefined8 *)(ray + 0x90);
      local_a2c0._152_8_ = *(undefined8 *)(ray + 0x98);
      local_a2c0._160_8_ = *(undefined8 *)(ray + 0xa0);
      local_a2c0._168_8_ = *(undefined8 *)(ray + 0xa8);
      local_a2c0._176_8_ = *(undefined8 *)(ray + 0xb0);
      local_a2c0._184_8_ = *(undefined8 *)(ray + 0xb8);
      local_a200 = *(undefined1 (*) [64])(ray + 0x100);
      local_a1c0 = *(undefined1 (*) [64])(ray + 0x140);
      local_a180 = *(undefined1 (*) [64])(ray + 0x180);
      auVar64 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar63 = vandps_avx512dq(local_a200,auVar64);
      auVar65 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar47 = vcmpps_avx512f(auVar63,auVar65,1);
      auVar66 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar63 = vdivps_avx512f(auVar66,local_a200);
      auVar67 = vdivps_avx512f(auVar66,local_a1c0);
      auVar68 = vandps_avx512dq(local_a1c0,auVar64);
      uVar46 = vcmpps_avx512f(auVar68,auVar65,1);
      auVar68 = vandps_avx512dq(local_a180,auVar64);
      auVar69 = vdivps_avx512f(auVar66,local_a180);
      uVar53 = vcmpps_avx512f(auVar68,auVar65,1);
      auVar68 = vbroadcastss_avx512f(ZEXT416(0x5d5e0b6b));
      bVar55 = (bool)((byte)uVar47 & 1);
      iVar58 = auVar68._0_4_;
      local_a140._0_4_ = (uint)bVar55 * iVar58 | (uint)!bVar55 * auVar63._0_4_;
      bVar55 = (bool)((byte)(uVar47 >> 1) & 1);
      iVar106 = auVar68._4_4_;
      local_a140._4_4_ = (uint)bVar55 * iVar106 | (uint)!bVar55 * auVar63._4_4_;
      bVar55 = (bool)((byte)(uVar47 >> 2) & 1);
      iVar107 = auVar68._8_4_;
      local_a140._8_4_ = (uint)bVar55 * iVar107 | (uint)!bVar55 * auVar63._8_4_;
      bVar55 = (bool)((byte)(uVar47 >> 3) & 1);
      iVar108 = auVar68._12_4_;
      local_a140._12_4_ = (uint)bVar55 * iVar108 | (uint)!bVar55 * auVar63._12_4_;
      bVar55 = (bool)((byte)(uVar47 >> 4) & 1);
      iVar109 = auVar68._16_4_;
      local_a140._16_4_ = (uint)bVar55 * iVar109 | (uint)!bVar55 * auVar63._16_4_;
      bVar55 = (bool)((byte)(uVar47 >> 5) & 1);
      iVar110 = auVar68._20_4_;
      local_a140._20_4_ = (uint)bVar55 * iVar110 | (uint)!bVar55 * auVar63._20_4_;
      bVar55 = (bool)((byte)(uVar47 >> 6) & 1);
      iVar111 = auVar68._24_4_;
      local_a140._24_4_ = (uint)bVar55 * iVar111 | (uint)!bVar55 * auVar63._24_4_;
      bVar55 = (bool)((byte)(uVar47 >> 7) & 1);
      iVar112 = auVar68._28_4_;
      local_a140._28_4_ = (uint)bVar55 * iVar112 | (uint)!bVar55 * auVar63._28_4_;
      bVar55 = (bool)((byte)(uVar47 >> 8) & 1);
      iVar113 = auVar68._32_4_;
      local_a140._32_4_ = (uint)bVar55 * iVar113 | (uint)!bVar55 * auVar63._32_4_;
      bVar55 = (bool)((byte)(uVar47 >> 9) & 1);
      iVar114 = auVar68._36_4_;
      local_a140._36_4_ = (uint)bVar55 * iVar114 | (uint)!bVar55 * auVar63._36_4_;
      bVar55 = (bool)((byte)(uVar47 >> 10) & 1);
      iVar115 = auVar68._40_4_;
      local_a140._40_4_ = (uint)bVar55 * iVar115 | (uint)!bVar55 * auVar63._40_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xb) & 1);
      iVar116 = auVar68._44_4_;
      local_a140._44_4_ = (uint)bVar55 * iVar116 | (uint)!bVar55 * auVar63._44_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xc) & 1);
      iVar117 = auVar68._48_4_;
      local_a140._48_4_ = (uint)bVar55 * iVar117 | (uint)!bVar55 * auVar63._48_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xd) & 1);
      iVar118 = auVar68._52_4_;
      local_a140._52_4_ = (uint)bVar55 * iVar118 | (uint)!bVar55 * auVar63._52_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xe) & 1);
      iVar119 = auVar68._56_4_;
      iVar120 = auVar68._60_4_;
      local_a140._56_4_ = (uint)bVar55 * iVar119 | (uint)!bVar55 * auVar63._56_4_;
      bVar55 = SUB81(uVar47 >> 0xf,0);
      local_a140._60_4_ = (uint)bVar55 * iVar120 | (uint)!bVar55 * auVar63._60_4_;
      bVar55 = (bool)((byte)uVar46 & 1);
      local_a100._0_4_ = (uint)bVar55 * iVar58 | (uint)!bVar55 * auVar67._0_4_;
      bVar55 = (bool)((byte)(uVar46 >> 1) & 1);
      local_a100._4_4_ = (uint)bVar55 * iVar106 | (uint)!bVar55 * auVar67._4_4_;
      bVar55 = (bool)((byte)(uVar46 >> 2) & 1);
      local_a100._8_4_ = (uint)bVar55 * iVar107 | (uint)!bVar55 * auVar67._8_4_;
      bVar55 = (bool)((byte)(uVar46 >> 3) & 1);
      local_a100._12_4_ = (uint)bVar55 * iVar108 | (uint)!bVar55 * auVar67._12_4_;
      bVar55 = (bool)((byte)(uVar46 >> 4) & 1);
      local_a100._16_4_ = (uint)bVar55 * iVar109 | (uint)!bVar55 * auVar67._16_4_;
      bVar55 = (bool)((byte)(uVar46 >> 5) & 1);
      local_a100._20_4_ = (uint)bVar55 * iVar110 | (uint)!bVar55 * auVar67._20_4_;
      bVar55 = (bool)((byte)(uVar46 >> 6) & 1);
      local_a100._24_4_ = (uint)bVar55 * iVar111 | (uint)!bVar55 * auVar67._24_4_;
      bVar55 = (bool)((byte)(uVar46 >> 7) & 1);
      local_a100._28_4_ = (uint)bVar55 * iVar112 | (uint)!bVar55 * auVar67._28_4_;
      bVar55 = (bool)((byte)(uVar46 >> 8) & 1);
      local_a100._32_4_ = (uint)bVar55 * iVar113 | (uint)!bVar55 * auVar67._32_4_;
      bVar55 = (bool)((byte)(uVar46 >> 9) & 1);
      local_a100._36_4_ = (uint)bVar55 * iVar114 | (uint)!bVar55 * auVar67._36_4_;
      bVar55 = (bool)((byte)(uVar46 >> 10) & 1);
      local_a100._40_4_ = (uint)bVar55 * iVar115 | (uint)!bVar55 * auVar67._40_4_;
      bVar55 = (bool)((byte)(uVar46 >> 0xb) & 1);
      local_a100._44_4_ = (uint)bVar55 * iVar116 | (uint)!bVar55 * auVar67._44_4_;
      bVar55 = (bool)((byte)(uVar46 >> 0xc) & 1);
      local_a100._48_4_ = (uint)bVar55 * iVar117 | (uint)!bVar55 * auVar67._48_4_;
      bVar55 = (bool)((byte)(uVar46 >> 0xd) & 1);
      local_a100._52_4_ = (uint)bVar55 * iVar118 | (uint)!bVar55 * auVar67._52_4_;
      bVar55 = (bool)((byte)(uVar46 >> 0xe) & 1);
      local_a100._56_4_ = (uint)bVar55 * iVar119 | (uint)!bVar55 * auVar67._56_4_;
      bVar55 = SUB81(uVar46 >> 0xf,0);
      local_a100._60_4_ = (uint)bVar55 * iVar120 | (uint)!bVar55 * auVar67._60_4_;
      bVar55 = (bool)((byte)uVar53 & 1);
      local_a0c0._0_4_ = (uint)bVar55 * iVar58 | (uint)!bVar55 * auVar69._0_4_;
      bVar55 = (bool)((byte)(uVar53 >> 1) & 1);
      local_a0c0._4_4_ = (uint)bVar55 * iVar106 | (uint)!bVar55 * auVar69._4_4_;
      bVar55 = (bool)((byte)(uVar53 >> 2) & 1);
      local_a0c0._8_4_ = (uint)bVar55 * iVar107 | (uint)!bVar55 * auVar69._8_4_;
      bVar55 = (bool)((byte)(uVar53 >> 3) & 1);
      local_a0c0._12_4_ = (uint)bVar55 * iVar108 | (uint)!bVar55 * auVar69._12_4_;
      bVar55 = (bool)((byte)(uVar53 >> 4) & 1);
      local_a0c0._16_4_ = (uint)bVar55 * iVar109 | (uint)!bVar55 * auVar69._16_4_;
      bVar55 = (bool)((byte)(uVar53 >> 5) & 1);
      local_a0c0._20_4_ = (uint)bVar55 * iVar110 | (uint)!bVar55 * auVar69._20_4_;
      bVar55 = (bool)((byte)(uVar53 >> 6) & 1);
      local_a0c0._24_4_ = (uint)bVar55 * iVar111 | (uint)!bVar55 * auVar69._24_4_;
      bVar55 = (bool)((byte)(uVar53 >> 7) & 1);
      local_a0c0._28_4_ = (uint)bVar55 * iVar112 | (uint)!bVar55 * auVar69._28_4_;
      bVar55 = (bool)((byte)(uVar53 >> 8) & 1);
      local_a0c0._32_4_ = (uint)bVar55 * iVar113 | (uint)!bVar55 * auVar69._32_4_;
      bVar55 = (bool)((byte)(uVar53 >> 9) & 1);
      local_a0c0._36_4_ = (uint)bVar55 * iVar114 | (uint)!bVar55 * auVar69._36_4_;
      bVar55 = (bool)((byte)(uVar53 >> 10) & 1);
      local_a0c0._40_4_ = (uint)bVar55 * iVar115 | (uint)!bVar55 * auVar69._40_4_;
      bVar55 = (bool)((byte)(uVar53 >> 0xb) & 1);
      local_a0c0._44_4_ = (uint)bVar55 * iVar116 | (uint)!bVar55 * auVar69._44_4_;
      bVar55 = (bool)((byte)(uVar53 >> 0xc) & 1);
      local_a0c0._48_4_ = (uint)bVar55 * iVar117 | (uint)!bVar55 * auVar69._48_4_;
      bVar55 = (bool)((byte)(uVar53 >> 0xd) & 1);
      local_a0c0._52_4_ = (uint)bVar55 * iVar118 | (uint)!bVar55 * auVar69._52_4_;
      bVar55 = (bool)((byte)(uVar53 >> 0xe) & 1);
      local_a0c0._56_4_ = (uint)bVar55 * iVar119 | (uint)!bVar55 * auVar69._56_4_;
      bVar55 = SUB81(uVar53 >> 0xf,0);
      local_a0c0._60_4_ = (uint)bVar55 * iVar120 | (uint)!bVar55 * auVar69._60_4_;
      uVar47 = vcmpps_avx512f(local_a140,auVar121,1);
      auVar63 = vpbroadcastd_avx512f(ZEXT416(0x20));
      auVar67._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar63._4_4_;
      auVar67._0_4_ = (uint)((byte)uVar47 & 1) * auVar63._0_4_;
      auVar67._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar63._8_4_;
      auVar67._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar63._12_4_;
      auVar67._16_4_ = (uint)((byte)(uVar47 >> 4) & 1) * auVar63._16_4_;
      auVar67._20_4_ = (uint)((byte)(uVar47 >> 5) & 1) * auVar63._20_4_;
      auVar67._24_4_ = (uint)((byte)(uVar47 >> 6) & 1) * auVar63._24_4_;
      auVar67._28_4_ = (uint)((byte)(uVar47 >> 7) & 1) * auVar63._28_4_;
      auVar67._32_4_ = (uint)((byte)(uVar47 >> 8) & 1) * auVar63._32_4_;
      auVar67._36_4_ = (uint)((byte)(uVar47 >> 9) & 1) * auVar63._36_4_;
      auVar67._40_4_ = (uint)((byte)(uVar47 >> 10) & 1) * auVar63._40_4_;
      auVar67._44_4_ = (uint)((byte)(uVar47 >> 0xb) & 1) * auVar63._44_4_;
      auVar67._48_4_ = (uint)((byte)(uVar47 >> 0xc) & 1) * auVar63._48_4_;
      auVar67._52_4_ = (uint)((byte)(uVar47 >> 0xd) & 1) * auVar63._52_4_;
      auVar67._56_4_ = (uint)((byte)(uVar47 >> 0xe) & 1) * auVar63._56_4_;
      auVar67._60_4_ = (uint)(byte)(uVar47 >> 0xf) * auVar63._60_4_;
      local_a080 = vmovdqa64_avx512f(auVar67);
      uVar47 = vcmpps_avx512f(local_a100,auVar121,5);
      auVar63 = vpbroadcastd_avx512f(ZEXT416(0x60));
      auVar67 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar55 = (bool)((byte)uVar47 & 1);
      auVar68._0_4_ = (uint)bVar55 * auVar67._0_4_ | (uint)!bVar55 * auVar63._0_4_;
      bVar55 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar68._4_4_ = (uint)bVar55 * auVar67._4_4_ | (uint)!bVar55 * auVar63._4_4_;
      bVar55 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar68._8_4_ = (uint)bVar55 * auVar67._8_4_ | (uint)!bVar55 * auVar63._8_4_;
      bVar55 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar68._12_4_ = (uint)bVar55 * auVar67._12_4_ | (uint)!bVar55 * auVar63._12_4_;
      bVar55 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar68._16_4_ = (uint)bVar55 * auVar67._16_4_ | (uint)!bVar55 * auVar63._16_4_;
      bVar55 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar68._20_4_ = (uint)bVar55 * auVar67._20_4_ | (uint)!bVar55 * auVar63._20_4_;
      bVar55 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar68._24_4_ = (uint)bVar55 * auVar67._24_4_ | (uint)!bVar55 * auVar63._24_4_;
      bVar55 = (bool)((byte)(uVar47 >> 7) & 1);
      auVar68._28_4_ = (uint)bVar55 * auVar67._28_4_ | (uint)!bVar55 * auVar63._28_4_;
      bVar55 = (bool)((byte)(uVar47 >> 8) & 1);
      auVar68._32_4_ = (uint)bVar55 * auVar67._32_4_ | (uint)!bVar55 * auVar63._32_4_;
      bVar55 = (bool)((byte)(uVar47 >> 9) & 1);
      auVar68._36_4_ = (uint)bVar55 * auVar67._36_4_ | (uint)!bVar55 * auVar63._36_4_;
      bVar55 = (bool)((byte)(uVar47 >> 10) & 1);
      auVar68._40_4_ = (uint)bVar55 * auVar67._40_4_ | (uint)!bVar55 * auVar63._40_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xb) & 1);
      auVar68._44_4_ = (uint)bVar55 * auVar67._44_4_ | (uint)!bVar55 * auVar63._44_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xc) & 1);
      auVar68._48_4_ = (uint)bVar55 * auVar67._48_4_ | (uint)!bVar55 * auVar63._48_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xd) & 1);
      auVar68._52_4_ = (uint)bVar55 * auVar67._52_4_ | (uint)!bVar55 * auVar63._52_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xe) & 1);
      auVar68._56_4_ = (uint)bVar55 * auVar67._56_4_ | (uint)!bVar55 * auVar63._56_4_;
      bVar55 = SUB81(uVar47 >> 0xf,0);
      auVar68._60_4_ = (uint)bVar55 * auVar67._60_4_ | (uint)!bVar55 * auVar63._60_4_;
      local_a040 = vmovdqa64_avx512f(auVar68);
      uVar47 = vcmpps_avx512f(local_a0c0,auVar121,5);
      auVar63 = vpbroadcastd_avx512f(ZEXT416(0xa0));
      auVar67 = vpbroadcastd_avx512f(ZEXT416(0x80));
      bVar55 = (bool)((byte)uVar47 & 1);
      auVar69._0_4_ = (uint)bVar55 * auVar67._0_4_ | (uint)!bVar55 * auVar63._0_4_;
      bVar55 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar55 * auVar67._4_4_ | (uint)!bVar55 * auVar63._4_4_;
      bVar55 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar55 * auVar67._8_4_ | (uint)!bVar55 * auVar63._8_4_;
      bVar55 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar55 * auVar67._12_4_ | (uint)!bVar55 * auVar63._12_4_;
      bVar55 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar69._16_4_ = (uint)bVar55 * auVar67._16_4_ | (uint)!bVar55 * auVar63._16_4_;
      bVar55 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar69._20_4_ = (uint)bVar55 * auVar67._20_4_ | (uint)!bVar55 * auVar63._20_4_;
      bVar55 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar69._24_4_ = (uint)bVar55 * auVar67._24_4_ | (uint)!bVar55 * auVar63._24_4_;
      bVar55 = (bool)((byte)(uVar47 >> 7) & 1);
      auVar69._28_4_ = (uint)bVar55 * auVar67._28_4_ | (uint)!bVar55 * auVar63._28_4_;
      bVar55 = (bool)((byte)(uVar47 >> 8) & 1);
      auVar69._32_4_ = (uint)bVar55 * auVar67._32_4_ | (uint)!bVar55 * auVar63._32_4_;
      bVar55 = (bool)((byte)(uVar47 >> 9) & 1);
      auVar69._36_4_ = (uint)bVar55 * auVar67._36_4_ | (uint)!bVar55 * auVar63._36_4_;
      bVar55 = (bool)((byte)(uVar47 >> 10) & 1);
      auVar69._40_4_ = (uint)bVar55 * auVar67._40_4_ | (uint)!bVar55 * auVar63._40_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xb) & 1);
      auVar69._44_4_ = (uint)bVar55 * auVar67._44_4_ | (uint)!bVar55 * auVar63._44_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xc) & 1);
      auVar69._48_4_ = (uint)bVar55 * auVar67._48_4_ | (uint)!bVar55 * auVar63._48_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xd) & 1);
      auVar69._52_4_ = (uint)bVar55 * auVar67._52_4_ | (uint)!bVar55 * auVar63._52_4_;
      bVar55 = (bool)((byte)(uVar47 >> 0xe) & 1);
      auVar69._56_4_ = (uint)bVar55 * auVar67._56_4_ | (uint)!bVar55 * auVar63._56_4_;
      bVar55 = SUB81(uVar47 >> 0xf,0);
      auVar69._60_4_ = (uint)bVar55 * auVar67._60_4_ | (uint)!bVar55 * auVar63._60_4_;
      local_a000 = vmovdqa64_avx512f(auVar69);
      auVar67 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      local_a804 = (uint)uVar56;
      auVar63 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar121);
      bVar55 = (bool)((byte)uVar56 & 1);
      local_9fc0 = (uint)bVar55 * auVar63._0_4_ | (uint)!bVar55 * auVar67._0_4_;
      bVar55 = (bool)((byte)(uVar56 >> 1) & 1);
      uStack_9fbc = (uint)bVar55 * auVar63._4_4_ | (uint)!bVar55 * auVar67._4_4_;
      bVar55 = (bool)((byte)(uVar56 >> 2) & 1);
      uStack_9fb8 = (uint)bVar55 * auVar63._8_4_ | (uint)!bVar55 * auVar67._8_4_;
      bVar55 = (bool)((byte)(uVar56 >> 3) & 1);
      uStack_9fb4 = (uint)bVar55 * auVar63._12_4_ | (uint)!bVar55 * auVar67._12_4_;
      bVar55 = (bool)((byte)(uVar56 >> 4) & 1);
      uStack_9fb0 = (uint)bVar55 * auVar63._16_4_ | (uint)!bVar55 * auVar67._16_4_;
      bVar55 = (bool)((byte)(uVar56 >> 5) & 1);
      uStack_9fac = (uint)bVar55 * auVar63._20_4_ | (uint)!bVar55 * auVar67._20_4_;
      bVar55 = (bool)((byte)(uVar56 >> 6) & 1);
      uStack_9fa8 = (uint)bVar55 * auVar63._24_4_ | (uint)!bVar55 * auVar67._24_4_;
      bVar55 = (bool)((byte)(uVar56 >> 7) & 1);
      uStack_9fa4 = (uint)bVar55 * auVar63._28_4_ | (uint)!bVar55 * auVar67._28_4_;
      bVar13 = (byte)(uVar56 >> 8);
      bVar55 = (bool)(bVar13 & 1);
      uStack_9fa0 = (uint)bVar55 * auVar63._32_4_ | (uint)!bVar55 * auVar67._32_4_;
      bVar55 = (bool)((byte)(uVar56 >> 9) & 1);
      uStack_9f9c = (uint)bVar55 * auVar63._36_4_ | (uint)!bVar55 * auVar67._36_4_;
      bVar55 = (bool)((byte)(uVar56 >> 10) & 1);
      uStack_9f98 = (uint)bVar55 * auVar63._40_4_ | (uint)!bVar55 * auVar67._40_4_;
      bVar55 = (bool)((byte)(uVar56 >> 0xb) & 1);
      uStack_9f94 = (uint)bVar55 * auVar63._44_4_ | (uint)!bVar55 * auVar67._44_4_;
      bVar55 = (bool)((byte)(uVar56 >> 0xc) & 1);
      uStack_9f90 = (uint)bVar55 * auVar63._48_4_ | (uint)!bVar55 * auVar67._48_4_;
      bVar55 = (bool)((byte)(uVar56 >> 0xd) & 1);
      uStack_9f8c = (uint)bVar55 * auVar63._52_4_ | (uint)!bVar55 * auVar67._52_4_;
      bVar55 = (bool)((byte)(uVar56 >> 0xe) & 1);
      uStack_9f88 = (uint)bVar55 * auVar63._56_4_ | (uint)!bVar55 * auVar67._56_4_;
      bVar55 = SUB81(uVar56 >> 0xf,0);
      uStack_9f84 = (uint)bVar55 * auVar63._60_4_ | (uint)!bVar55 * auVar67._60_4_;
      auVar68 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar63 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar121);
      bVar55 = (bool)((byte)uVar56 & 1);
      bVar6 = (bool)((byte)(uVar56 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar56 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar56 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar56 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar56 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar56 >> 7) & 1);
      bVar14 = (bool)(bVar13 & 1);
      bVar15 = (bool)((byte)(uVar56 >> 9) & 1);
      bVar16 = (bool)((byte)(uVar56 >> 10) & 1);
      bVar17 = (bool)((byte)(uVar56 >> 0xb) & 1);
      bVar18 = (bool)((byte)(uVar56 >> 0xc) & 1);
      bVar19 = (bool)((byte)(uVar56 >> 0xd) & 1);
      bVar20 = (bool)((byte)(uVar56 >> 0xe) & 1);
      bVar21 = SUB81(uVar56 >> 0xf,0);
      local_9f80 = (uint)bVar55 * auVar63._0_4_ | (uint)!bVar55 * auVar68._0_4_;
      uStack_9f7c = (uint)bVar6 * auVar63._4_4_ | (uint)!bVar6 * auVar68._4_4_;
      uStack_9f78 = (uint)bVar7 * auVar63._8_4_ | (uint)!bVar7 * auVar68._8_4_;
      uStack_9f74 = (uint)bVar8 * auVar63._12_4_ | (uint)!bVar8 * auVar68._12_4_;
      uStack_9f70 = (uint)bVar9 * auVar63._16_4_ | (uint)!bVar9 * auVar68._16_4_;
      uStack_9f6c = (uint)bVar10 * auVar63._20_4_ | (uint)!bVar10 * auVar68._20_4_;
      uStack_9f68 = (uint)bVar11 * auVar63._24_4_ | (uint)!bVar11 * auVar68._24_4_;
      uStack_9f64 = (uint)bVar12 * auVar63._28_4_ | (uint)!bVar12 * auVar68._28_4_;
      uStack_9f60 = (uint)bVar14 * auVar63._32_4_ | (uint)!bVar14 * auVar68._32_4_;
      uStack_9f5c = (uint)bVar15 * auVar63._36_4_ | (uint)!bVar15 * auVar68._36_4_;
      uStack_9f58 = (uint)bVar16 * auVar63._40_4_ | (uint)!bVar16 * auVar68._40_4_;
      uStack_9f54 = (uint)bVar17 * auVar63._44_4_ | (uint)!bVar17 * auVar68._44_4_;
      uStack_9f50 = (uint)bVar18 * auVar63._48_4_ | (uint)!bVar18 * auVar68._48_4_;
      uStack_9f4c = (uint)bVar19 * auVar63._52_4_ | (uint)!bVar19 * auVar68._52_4_;
      uStack_9f48 = (uint)bVar20 * auVar63._56_4_ | (uint)!bVar20 * auVar68._56_4_;
      uStack_9f44 = (uint)bVar21 * auVar63._60_4_ | (uint)!bVar21 * auVar68._60_4_;
      local_a864 = (uint)(ushort)~(ushort)uVar56;
      local_a7a0 = This;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar52 = 0xe;
      }
      else {
        uVar52 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar52 = 0xe;
        }
      }
      local_a810 = ray + 0x200;
      puVar54 = local_9e40;
      local_9e50 = 0xfffffffffffffff8;
      pauVar50 = (undefined1 (*) [64])local_8c40;
      local_9e48 = (local_a818->root).ptr;
      local_8c80 = local_9fc0;
      uStack_8c7c = uStack_9fbc;
      uStack_8c78 = uStack_9fb8;
      uStack_8c74 = uStack_9fb4;
      uStack_8c70 = uStack_9fb0;
      uStack_8c6c = uStack_9fac;
      uStack_8c68 = uStack_9fa8;
      uStack_8c64 = uStack_9fa4;
      uStack_8c60 = uStack_9fa0;
      uStack_8c5c = uStack_9f9c;
      uStack_8c58 = uStack_9f98;
      uStack_8c54 = uStack_9f94;
      uStack_8c50 = uStack_9f90;
      uStack_8c4c = uStack_9f8c;
      uStack_8c48 = uStack_9f88;
      uStack_8c44 = uStack_9f84;
      local_a798 = (undefined1 (*) [32])local_a440;
      auVar63 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
      auVar59 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
      auVar69 = ZEXT1664(auVar59);
      local_8cc0 = auVar67;
      do {
        pauVar50 = pauVar50 + -1;
        root.ptr = puVar54[-1];
        puVar54 = puVar54 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_008e6b42:
          iVar58 = 3;
        }
        else {
          local_a780 = *pauVar50;
          auVar79._4_4_ = uStack_9f7c;
          auVar79._0_4_ = local_9f80;
          auVar79._8_4_ = uStack_9f78;
          auVar79._12_4_ = uStack_9f74;
          auVar79._16_4_ = uStack_9f70;
          auVar79._20_4_ = uStack_9f6c;
          auVar79._24_4_ = uStack_9f68;
          auVar79._28_4_ = uStack_9f64;
          auVar79._32_4_ = uStack_9f60;
          auVar79._36_4_ = uStack_9f5c;
          auVar79._40_4_ = uStack_9f58;
          auVar79._44_4_ = uStack_9f54;
          auVar79._48_4_ = uStack_9f50;
          auVar79._52_4_ = uStack_9f4c;
          auVar79._56_4_ = uStack_9f48;
          auVar79._60_4_ = uStack_9f44;
          uVar56 = vcmpps_avx512f(local_a780,auVar79,1);
          if ((short)uVar56 == 0) {
LAB_008e6b53:
            iVar58 = 2;
          }
          else {
            uVar48 = (undefined4)uVar56;
            iVar58 = 0;
            if ((uint)POPCOUNT(uVar48) <= uVar52) {
              do {
                k = 0;
                for (uVar47 = uVar56; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                bVar55 = occluded1(local_a7a0,local_a818,root,k,&local_a829,ray,
                                   (TravRayK<16,_true> *)&local_a2c0.field_0,context);
                uVar44 = 1 << ((uint)k & 0x1f);
                if (!bVar55) {
                  uVar44 = 0;
                }
                local_a864 = local_a864 | uVar44;
                uVar56 = uVar56 - 1 & uVar56;
              } while (uVar56 != 0);
              if ((short)local_a864 == -1) {
                iVar58 = 3;
              }
              else {
                auVar63 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar55 = (bool)((byte)local_a864 & 1);
                bVar6 = (bool)((byte)(local_a864 >> 1) & 1);
                bVar7 = (bool)((byte)(local_a864 >> 2) & 1);
                bVar8 = (bool)((byte)(local_a864 >> 3) & 1);
                bVar9 = (bool)((byte)(local_a864 >> 4) & 1);
                bVar10 = (bool)((byte)(local_a864 >> 5) & 1);
                bVar11 = (bool)((byte)(local_a864 >> 6) & 1);
                bVar12 = (bool)((byte)(local_a864 >> 7) & 1);
                bVar14 = (bool)((byte)(local_a864 >> 8) & 1);
                bVar15 = (bool)((byte)(local_a864 >> 9) & 1);
                bVar16 = (bool)((byte)(local_a864 >> 10) & 1);
                bVar17 = (bool)((byte)(local_a864 >> 0xb) & 1);
                bVar18 = (bool)((byte)(local_a864 >> 0xc) & 1);
                bVar19 = (bool)((byte)(local_a864 >> 0xd) & 1);
                bVar20 = (bool)((byte)(local_a864 >> 0xe) & 1);
                bVar21 = (bool)((byte)(local_a864 >> 0xf) & 1);
                local_9f80 = (uint)bVar55 * auVar63._0_4_ | !bVar55 * local_9f80;
                uStack_9f7c = (uint)bVar6 * auVar63._4_4_ | !bVar6 * uStack_9f7c;
                uStack_9f78 = (uint)bVar7 * auVar63._8_4_ | !bVar7 * uStack_9f78;
                uStack_9f74 = (uint)bVar8 * auVar63._12_4_ | !bVar8 * uStack_9f74;
                uStack_9f70 = (uint)bVar9 * auVar63._16_4_ | !bVar9 * uStack_9f70;
                uStack_9f6c = (uint)bVar10 * auVar63._20_4_ | !bVar10 * uStack_9f6c;
                uStack_9f68 = (uint)bVar11 * auVar63._24_4_ | !bVar11 * uStack_9f68;
                uStack_9f64 = (uint)bVar12 * auVar63._28_4_ | !bVar12 * uStack_9f64;
                uStack_9f60 = (uint)bVar14 * auVar63._32_4_ | !bVar14 * uStack_9f60;
                uStack_9f5c = (uint)bVar15 * auVar63._36_4_ | !bVar15 * uStack_9f5c;
                uStack_9f58 = (uint)bVar16 * auVar63._40_4_ | !bVar16 * uStack_9f58;
                uStack_9f54 = (uint)bVar17 * auVar63._44_4_ | !bVar17 * uStack_9f54;
                uStack_9f50 = (uint)bVar18 * auVar63._48_4_ | !bVar18 * uStack_9f50;
                uStack_9f4c = (uint)bVar19 * auVar63._52_4_ | !bVar19 * uStack_9f4c;
                uStack_9f48 = (uint)bVar20 * auVar63._56_4_ | !bVar20 * uStack_9f48;
                uStack_9f44 = (uint)bVar21 * auVar63._60_4_ | !bVar21 * uStack_9f44;
                iVar58 = 2;
              }
              auVar64 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
              auVar65 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
              auVar66 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
              auVar68 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              auVar67 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              auVar63 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
              auVar121 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
              auVar59 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
              auVar69 = ZEXT1664(auVar59);
            }
            if (uVar52 < (uint)POPCOUNT(uVar48)) {
              do {
                uVar44 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_008e6b42;
                  auVar80._4_4_ = uStack_9f7c;
                  auVar80._0_4_ = local_9f80;
                  auVar80._8_4_ = uStack_9f78;
                  auVar80._12_4_ = uStack_9f74;
                  auVar80._16_4_ = uStack_9f70;
                  auVar80._20_4_ = uStack_9f6c;
                  auVar80._24_4_ = uStack_9f68;
                  auVar80._28_4_ = uStack_9f64;
                  auVar80._32_4_ = uStack_9f60;
                  auVar80._36_4_ = uStack_9f5c;
                  auVar80._40_4_ = uStack_9f58;
                  auVar80._44_4_ = uStack_9f54;
                  auVar80._48_4_ = uStack_9f50;
                  auVar80._52_4_ = uStack_9f4c;
                  auVar80._56_4_ = uStack_9f48;
                  auVar80._60_4_ = uStack_9f44;
                  uVar24 = vcmpps_avx512f(local_a780,auVar80,9);
                  if ((short)uVar24 != 0) {
                    local_a790 = (ulong)(uVar44 & 0xf) - 8;
                    uVar44 = local_a864;
                    if (local_a790 != 0) {
                      uVar44 = ~local_a864;
                      uVar56 = 0;
                      do {
                        uVar46 = (ulong)uVar44;
                        lVar51 = uVar56 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        local_a828 = 0;
                        local_a820 = uVar46 & 0xffff;
                        for (uVar47 = local_a820; (uVar47 & 1) == 0;
                            uVar47 = uVar47 >> 1 | 0x8000000000000000) {
                          local_a828 = local_a828 + 1;
                        }
                        local_a788 = uVar56;
                        uVar56 = 0;
                        while( true ) {
                          uVar49 = (ushort)uVar46;
                          auVar59 = auVar69._0_16_;
                          local_a84c = (ushort)uVar44;
                          if (*(int *)(lVar51 + 0x50 + uVar56 * 4) == -1) break;
                          pGVar1 = (context->scene->geometries).items
                                   [*(uint *)(lVar51 + 0x40 + uVar56 * 4)].ptr;
                          auVar121 = vbroadcastss_avx512f(ZEXT416((uint)(pGVar1->time_range).lower))
                          ;
                          auVar79 = vbroadcastss_avx512f(ZEXT416((uint)pGVar1->fnumTimeSegments));
                          auVar80 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar121);
                          auVar121 = vbroadcastss_avx512f
                                               (ZEXT416((uint)((pGVar1->time_range).upper -
                                                              auVar121._0_4_)));
                          auVar121 = vdivps_avx512f(auVar80,auVar121);
                          auVar121 = vmulps_avx512f(auVar79,auVar121);
                          auVar80 = vrndscaleps_avx512f(auVar121,1);
                          auVar79 = vbroadcastss_avx512f(ZEXT416((uint)(auVar79._0_4_ + -1.0)));
                          auVar79 = vminps_avx512f(auVar80,auVar79);
                          auVar79 = vmaxps_avx512f(auVar79,auVar69);
                          auVar80 = vsubps_avx512f(auVar121,auVar79);
                          auVar79 = vcvtps2dq_avx512f(auVar79);
                          auVar121 = vmovdqa64_avx512f(auVar79);
                          _local_a800 = auVar121;
                          auVar70 = vpbroadcastd_avx512f();
                          uVar24 = vpcmpd_avx512f(auVar70,auVar79,4);
                          if (((ushort)uVar24 & local_a84c) == 0) {
                            lVar2 = *(long *)(*(long *)&pGVar1[2].numPrimitives +
                                             (long)*(int *)(local_a800 + local_a828 * 4) * 0x38);
                            lVar3 = *(long *)(*(long *)&pGVar1[2].numPrimitives + 0x38 +
                                             (long)*(int *)(local_a800 + local_a828 * 4) * 0x38);
                            uVar47 = (ulong)*(uint *)(lVar51 + uVar56 * 4);
                            uVar53 = (ulong)*(uint *)(lVar51 + 0x10 + uVar56 * 4);
                            auVar81 = vsubps_avx512f(auVar66,auVar80);
                            uVar48 = *(undefined4 *)(lVar3 + uVar47 * 4);
                            auVar70._4_4_ = uVar48;
                            auVar70._0_4_ = uVar48;
                            auVar70._8_4_ = uVar48;
                            auVar70._12_4_ = uVar48;
                            auVar70._16_4_ = uVar48;
                            auVar70._20_4_ = uVar48;
                            auVar70._24_4_ = uVar48;
                            auVar70._28_4_ = uVar48;
                            auVar70._32_4_ = uVar48;
                            auVar70._36_4_ = uVar48;
                            auVar70._40_4_ = uVar48;
                            auVar70._44_4_ = uVar48;
                            auVar70._48_4_ = uVar48;
                            auVar70._52_4_ = uVar48;
                            auVar70._56_4_ = uVar48;
                            auVar70._60_4_ = uVar48;
                            auVar79 = vmulps_avx512f(auVar80,auVar70);
                            uVar48 = *(undefined4 *)(lVar3 + 4 + uVar47 * 4);
                            auVar71._4_4_ = uVar48;
                            auVar71._0_4_ = uVar48;
                            auVar71._8_4_ = uVar48;
                            auVar71._12_4_ = uVar48;
                            auVar71._16_4_ = uVar48;
                            auVar71._20_4_ = uVar48;
                            auVar71._24_4_ = uVar48;
                            auVar71._28_4_ = uVar48;
                            auVar71._32_4_ = uVar48;
                            auVar71._36_4_ = uVar48;
                            auVar71._40_4_ = uVar48;
                            auVar71._44_4_ = uVar48;
                            auVar71._48_4_ = uVar48;
                            auVar71._52_4_ = uVar48;
                            auVar71._56_4_ = uVar48;
                            auVar71._60_4_ = uVar48;
                            auVar71 = vmulps_avx512f(auVar80,auVar71);
                            uVar48 = *(undefined4 *)(lVar3 + 8 + uVar47 * 4);
                            auVar72._4_4_ = uVar48;
                            auVar72._0_4_ = uVar48;
                            auVar72._8_4_ = uVar48;
                            auVar72._12_4_ = uVar48;
                            auVar72._16_4_ = uVar48;
                            auVar72._20_4_ = uVar48;
                            auVar72._24_4_ = uVar48;
                            auVar72._28_4_ = uVar48;
                            auVar72._32_4_ = uVar48;
                            auVar72._36_4_ = uVar48;
                            auVar72._40_4_ = uVar48;
                            auVar72._44_4_ = uVar48;
                            auVar72._48_4_ = uVar48;
                            auVar72._52_4_ = uVar48;
                            auVar72._56_4_ = uVar48;
                            auVar72._60_4_ = uVar48;
                            auVar72 = vmulps_avx512f(auVar80,auVar72);
                            uVar48 = *(undefined4 *)(lVar2 + uVar47 * 4);
                            auVar73._4_4_ = uVar48;
                            auVar73._0_4_ = uVar48;
                            auVar73._8_4_ = uVar48;
                            auVar73._12_4_ = uVar48;
                            auVar73._16_4_ = uVar48;
                            auVar73._20_4_ = uVar48;
                            auVar73._24_4_ = uVar48;
                            auVar73._28_4_ = uVar48;
                            auVar73._32_4_ = uVar48;
                            auVar73._36_4_ = uVar48;
                            auVar73._40_4_ = uVar48;
                            auVar73._44_4_ = uVar48;
                            auVar73._48_4_ = uVar48;
                            auVar73._52_4_ = uVar48;
                            auVar73._56_4_ = uVar48;
                            auVar73._60_4_ = uVar48;
                            auVar70 = vfmadd231ps_avx512f(auVar79,auVar81,auVar73);
                            uVar48 = *(undefined4 *)(lVar2 + 4 + uVar47 * 4);
                            auVar74._4_4_ = uVar48;
                            auVar74._0_4_ = uVar48;
                            auVar74._8_4_ = uVar48;
                            auVar74._12_4_ = uVar48;
                            auVar74._16_4_ = uVar48;
                            auVar74._20_4_ = uVar48;
                            auVar74._24_4_ = uVar48;
                            auVar74._28_4_ = uVar48;
                            auVar74._32_4_ = uVar48;
                            auVar74._36_4_ = uVar48;
                            auVar74._40_4_ = uVar48;
                            auVar74._44_4_ = uVar48;
                            auVar74._48_4_ = uVar48;
                            auVar74._52_4_ = uVar48;
                            auVar74._56_4_ = uVar48;
                            auVar74._60_4_ = uVar48;
                            auVar71 = vfmadd231ps_avx512f(auVar71,auVar81,auVar74);
                            uVar48 = *(undefined4 *)(lVar2 + 8 + uVar47 * 4);
                            auVar75._4_4_ = uVar48;
                            auVar75._0_4_ = uVar48;
                            auVar75._8_4_ = uVar48;
                            auVar75._12_4_ = uVar48;
                            auVar75._16_4_ = uVar48;
                            auVar75._20_4_ = uVar48;
                            auVar75._24_4_ = uVar48;
                            auVar75._28_4_ = uVar48;
                            auVar75._32_4_ = uVar48;
                            auVar75._36_4_ = uVar48;
                            auVar75._40_4_ = uVar48;
                            auVar75._44_4_ = uVar48;
                            auVar75._48_4_ = uVar48;
                            auVar75._52_4_ = uVar48;
                            auVar75._56_4_ = uVar48;
                            auVar75._60_4_ = uVar48;
                            auVar72 = vfmadd231ps_avx512f(auVar72,auVar81,auVar75);
                            uVar48 = *(undefined4 *)(lVar3 + uVar53 * 4);
                            auVar76._4_4_ = uVar48;
                            auVar76._0_4_ = uVar48;
                            auVar76._8_4_ = uVar48;
                            auVar76._12_4_ = uVar48;
                            auVar76._16_4_ = uVar48;
                            auVar76._20_4_ = uVar48;
                            auVar76._24_4_ = uVar48;
                            auVar76._28_4_ = uVar48;
                            auVar76._32_4_ = uVar48;
                            auVar76._36_4_ = uVar48;
                            auVar76._40_4_ = uVar48;
                            auVar76._44_4_ = uVar48;
                            auVar76._48_4_ = uVar48;
                            auVar76._52_4_ = uVar48;
                            auVar76._56_4_ = uVar48;
                            auVar76._60_4_ = uVar48;
                            auVar79 = vmulps_avx512f(auVar80,auVar76);
                            uVar48 = *(undefined4 *)(lVar3 + 4 + uVar53 * 4);
                            auVar77._4_4_ = uVar48;
                            auVar77._0_4_ = uVar48;
                            auVar77._8_4_ = uVar48;
                            auVar77._12_4_ = uVar48;
                            auVar77._16_4_ = uVar48;
                            auVar77._20_4_ = uVar48;
                            auVar77._24_4_ = uVar48;
                            auVar77._28_4_ = uVar48;
                            auVar77._32_4_ = uVar48;
                            auVar77._36_4_ = uVar48;
                            auVar77._40_4_ = uVar48;
                            auVar77._44_4_ = uVar48;
                            auVar77._48_4_ = uVar48;
                            auVar77._52_4_ = uVar48;
                            auVar77._56_4_ = uVar48;
                            auVar77._60_4_ = uVar48;
                            auVar73 = vmulps_avx512f(auVar80,auVar77);
                            uVar48 = *(undefined4 *)(lVar3 + 8 + uVar53 * 4);
                            auVar82._4_4_ = uVar48;
                            auVar82._0_4_ = uVar48;
                            auVar82._8_4_ = uVar48;
                            auVar82._12_4_ = uVar48;
                            auVar82._16_4_ = uVar48;
                            auVar82._20_4_ = uVar48;
                            auVar82._24_4_ = uVar48;
                            auVar82._28_4_ = uVar48;
                            auVar82._32_4_ = uVar48;
                            auVar82._36_4_ = uVar48;
                            auVar82._40_4_ = uVar48;
                            auVar82._44_4_ = uVar48;
                            auVar82._48_4_ = uVar48;
                            auVar82._52_4_ = uVar48;
                            auVar82._56_4_ = uVar48;
                            auVar82._60_4_ = uVar48;
                            auVar74 = vmulps_avx512f(auVar80,auVar82);
                            uVar48 = *(undefined4 *)(lVar2 + uVar53 * 4);
                            auVar83._4_4_ = uVar48;
                            auVar83._0_4_ = uVar48;
                            auVar83._8_4_ = uVar48;
                            auVar83._12_4_ = uVar48;
                            auVar83._16_4_ = uVar48;
                            auVar83._20_4_ = uVar48;
                            auVar83._24_4_ = uVar48;
                            auVar83._28_4_ = uVar48;
                            auVar83._32_4_ = uVar48;
                            auVar83._36_4_ = uVar48;
                            auVar83._40_4_ = uVar48;
                            auVar83._44_4_ = uVar48;
                            auVar83._48_4_ = uVar48;
                            auVar83._52_4_ = uVar48;
                            auVar83._56_4_ = uVar48;
                            auVar83._60_4_ = uVar48;
                            local_9ec0 = vfmadd231ps_avx512f(auVar79,auVar81,auVar83);
                            uVar48 = *(undefined4 *)(lVar2 + 4 + uVar53 * 4);
                            auVar84._4_4_ = uVar48;
                            auVar84._0_4_ = uVar48;
                            auVar84._8_4_ = uVar48;
                            auVar84._12_4_ = uVar48;
                            auVar84._16_4_ = uVar48;
                            auVar84._20_4_ = uVar48;
                            auVar84._24_4_ = uVar48;
                            auVar84._28_4_ = uVar48;
                            auVar84._32_4_ = uVar48;
                            auVar84._36_4_ = uVar48;
                            auVar84._40_4_ = uVar48;
                            auVar84._44_4_ = uVar48;
                            auVar84._48_4_ = uVar48;
                            auVar84._52_4_ = uVar48;
                            auVar84._56_4_ = uVar48;
                            auVar84._60_4_ = uVar48;
                            local_9f00 = vfmadd231ps_avx512f(auVar73,auVar81,auVar84);
                            uVar48 = *(undefined4 *)(lVar2 + 8 + uVar53 * 4);
                            auVar85._4_4_ = uVar48;
                            auVar85._0_4_ = uVar48;
                            auVar85._8_4_ = uVar48;
                            auVar85._12_4_ = uVar48;
                            auVar85._16_4_ = uVar48;
                            auVar85._20_4_ = uVar48;
                            auVar85._24_4_ = uVar48;
                            auVar85._28_4_ = uVar48;
                            auVar85._32_4_ = uVar48;
                            auVar85._36_4_ = uVar48;
                            auVar85._40_4_ = uVar48;
                            auVar85._44_4_ = uVar48;
                            auVar85._48_4_ = uVar48;
                            auVar85._52_4_ = uVar48;
                            auVar85._56_4_ = uVar48;
                            auVar85._60_4_ = uVar48;
                            local_9f40 = vfmadd231ps_avx512f(auVar74,auVar81,auVar85);
                            uVar47 = (ulong)*(uint *)(lVar51 + 0x20 + uVar56 * 4);
                            uVar48 = *(undefined4 *)(lVar3 + uVar47 * 4);
                            auVar86._4_4_ = uVar48;
                            auVar86._0_4_ = uVar48;
                            auVar86._8_4_ = uVar48;
                            auVar86._12_4_ = uVar48;
                            auVar86._16_4_ = uVar48;
                            auVar86._20_4_ = uVar48;
                            auVar86._24_4_ = uVar48;
                            auVar86._28_4_ = uVar48;
                            auVar86._32_4_ = uVar48;
                            auVar86._36_4_ = uVar48;
                            auVar86._40_4_ = uVar48;
                            auVar86._44_4_ = uVar48;
                            auVar86._48_4_ = uVar48;
                            auVar86._52_4_ = uVar48;
                            auVar86._56_4_ = uVar48;
                            auVar86._60_4_ = uVar48;
                            auVar79 = vmulps_avx512f(auVar80,auVar86);
                            uVar48 = *(undefined4 *)(lVar3 + 4 + uVar47 * 4);
                            auVar87._4_4_ = uVar48;
                            auVar87._0_4_ = uVar48;
                            auVar87._8_4_ = uVar48;
                            auVar87._12_4_ = uVar48;
                            auVar87._16_4_ = uVar48;
                            auVar87._20_4_ = uVar48;
                            auVar87._24_4_ = uVar48;
                            auVar87._28_4_ = uVar48;
                            auVar87._32_4_ = uVar48;
                            auVar87._36_4_ = uVar48;
                            auVar87._40_4_ = uVar48;
                            auVar87._44_4_ = uVar48;
                            auVar87._48_4_ = uVar48;
                            auVar87._52_4_ = uVar48;
                            auVar87._56_4_ = uVar48;
                            auVar87._60_4_ = uVar48;
                            auVar73 = vmulps_avx512f(auVar80,auVar87);
                            uVar48 = *(undefined4 *)(lVar3 + 8 + uVar47 * 4);
                            auVar88._4_4_ = uVar48;
                            auVar88._0_4_ = uVar48;
                            auVar88._8_4_ = uVar48;
                            auVar88._12_4_ = uVar48;
                            auVar88._16_4_ = uVar48;
                            auVar88._20_4_ = uVar48;
                            auVar88._24_4_ = uVar48;
                            auVar88._28_4_ = uVar48;
                            auVar88._32_4_ = uVar48;
                            auVar88._36_4_ = uVar48;
                            auVar88._40_4_ = uVar48;
                            auVar88._44_4_ = uVar48;
                            auVar88._48_4_ = uVar48;
                            auVar88._52_4_ = uVar48;
                            auVar88._56_4_ = uVar48;
                            auVar88._60_4_ = uVar48;
                            auVar74 = vmulps_avx512f(auVar80,auVar88);
                            uVar48 = *(undefined4 *)(lVar2 + uVar47 * 4);
                            auVar89._4_4_ = uVar48;
                            auVar89._0_4_ = uVar48;
                            auVar89._8_4_ = uVar48;
                            auVar89._12_4_ = uVar48;
                            auVar89._16_4_ = uVar48;
                            auVar89._20_4_ = uVar48;
                            auVar89._24_4_ = uVar48;
                            auVar89._28_4_ = uVar48;
                            auVar89._32_4_ = uVar48;
                            auVar89._36_4_ = uVar48;
                            auVar89._40_4_ = uVar48;
                            auVar89._44_4_ = uVar48;
                            auVar89._48_4_ = uVar48;
                            auVar89._52_4_ = uVar48;
                            auVar89._56_4_ = uVar48;
                            auVar89._60_4_ = uVar48;
                            local_a300 = vfmadd231ps_avx512f(auVar79,auVar81,auVar89);
                            uVar48 = *(undefined4 *)(lVar2 + 4 + uVar47 * 4);
                            auVar90._4_4_ = uVar48;
                            auVar90._0_4_ = uVar48;
                            auVar90._8_4_ = uVar48;
                            auVar90._12_4_ = uVar48;
                            auVar90._16_4_ = uVar48;
                            auVar90._20_4_ = uVar48;
                            auVar90._24_4_ = uVar48;
                            auVar90._28_4_ = uVar48;
                            auVar90._32_4_ = uVar48;
                            auVar90._36_4_ = uVar48;
                            auVar90._40_4_ = uVar48;
                            auVar90._44_4_ = uVar48;
                            auVar90._48_4_ = uVar48;
                            auVar90._52_4_ = uVar48;
                            auVar90._56_4_ = uVar48;
                            auVar90._60_4_ = uVar48;
                            local_a340 = vfmadd231ps_avx512f(auVar73,auVar81,auVar90);
                            uVar48 = *(undefined4 *)(lVar2 + 8 + uVar47 * 4);
                            auVar91._4_4_ = uVar48;
                            auVar91._0_4_ = uVar48;
                            auVar91._8_4_ = uVar48;
                            auVar91._12_4_ = uVar48;
                            auVar91._16_4_ = uVar48;
                            auVar91._20_4_ = uVar48;
                            auVar91._24_4_ = uVar48;
                            auVar91._28_4_ = uVar48;
                            auVar91._32_4_ = uVar48;
                            auVar91._36_4_ = uVar48;
                            auVar91._40_4_ = uVar48;
                            auVar91._44_4_ = uVar48;
                            auVar91._48_4_ = uVar48;
                            auVar91._52_4_ = uVar48;
                            auVar91._56_4_ = uVar48;
                            auVar91._60_4_ = uVar48;
                            local_a380 = vfmadd231ps_avx512f(auVar74,auVar81,auVar91);
                            uVar47 = (ulong)*(uint *)(lVar51 + 0x30 + uVar56 * 4);
                            uVar48 = *(undefined4 *)(lVar3 + uVar47 * 4);
                            auVar92._4_4_ = uVar48;
                            auVar92._0_4_ = uVar48;
                            auVar92._8_4_ = uVar48;
                            auVar92._12_4_ = uVar48;
                            auVar92._16_4_ = uVar48;
                            auVar92._20_4_ = uVar48;
                            auVar92._24_4_ = uVar48;
                            auVar92._28_4_ = uVar48;
                            auVar92._32_4_ = uVar48;
                            auVar92._36_4_ = uVar48;
                            auVar92._40_4_ = uVar48;
                            auVar92._44_4_ = uVar48;
                            auVar92._48_4_ = uVar48;
                            auVar92._52_4_ = uVar48;
                            auVar92._56_4_ = uVar48;
                            auVar92._60_4_ = uVar48;
                            auVar79 = vmulps_avx512f(auVar80,auVar92);
                            uVar48 = *(undefined4 *)(lVar3 + 4 + uVar47 * 4);
                            auVar93._4_4_ = uVar48;
                            auVar93._0_4_ = uVar48;
                            auVar93._8_4_ = uVar48;
                            auVar93._12_4_ = uVar48;
                            auVar93._16_4_ = uVar48;
                            auVar93._20_4_ = uVar48;
                            auVar93._24_4_ = uVar48;
                            auVar93._28_4_ = uVar48;
                            auVar93._32_4_ = uVar48;
                            auVar93._36_4_ = uVar48;
                            auVar93._40_4_ = uVar48;
                            auVar93._44_4_ = uVar48;
                            auVar93._48_4_ = uVar48;
                            auVar93._52_4_ = uVar48;
                            auVar93._56_4_ = uVar48;
                            auVar93._60_4_ = uVar48;
                            auVar73 = vmulps_avx512f(auVar80,auVar93);
                            uVar48 = *(undefined4 *)(lVar3 + 8 + uVar47 * 4);
                            auVar94._4_4_ = uVar48;
                            auVar94._0_4_ = uVar48;
                            auVar94._8_4_ = uVar48;
                            auVar94._12_4_ = uVar48;
                            auVar94._16_4_ = uVar48;
                            auVar94._20_4_ = uVar48;
                            auVar94._24_4_ = uVar48;
                            auVar94._28_4_ = uVar48;
                            auVar94._32_4_ = uVar48;
                            auVar94._36_4_ = uVar48;
                            auVar94._40_4_ = uVar48;
                            auVar94._44_4_ = uVar48;
                            auVar94._48_4_ = uVar48;
                            auVar94._52_4_ = uVar48;
                            auVar94._56_4_ = uVar48;
                            auVar94._60_4_ = uVar48;
                            auVar80 = vmulps_avx512f(auVar80,auVar94);
                            uVar48 = *(undefined4 *)(lVar2 + uVar47 * 4);
                            auVar95._4_4_ = uVar48;
                            auVar95._0_4_ = uVar48;
                            auVar95._8_4_ = uVar48;
                            auVar95._12_4_ = uVar48;
                            auVar95._16_4_ = uVar48;
                            auVar95._20_4_ = uVar48;
                            auVar95._24_4_ = uVar48;
                            auVar95._28_4_ = uVar48;
                            auVar95._32_4_ = uVar48;
                            auVar95._36_4_ = uVar48;
                            auVar95._40_4_ = uVar48;
                            auVar95._44_4_ = uVar48;
                            auVar95._48_4_ = uVar48;
                            auVar95._52_4_ = uVar48;
                            auVar95._56_4_ = uVar48;
                            auVar95._60_4_ = uVar48;
                            auVar79 = vfmadd231ps_avx512f(auVar79,auVar81,auVar95);
                            uVar48 = *(undefined4 *)(lVar2 + 4 + uVar47 * 4);
                            auVar96._4_4_ = uVar48;
                            auVar96._0_4_ = uVar48;
                            auVar96._8_4_ = uVar48;
                            auVar96._12_4_ = uVar48;
                            auVar96._16_4_ = uVar48;
                            auVar96._20_4_ = uVar48;
                            auVar96._24_4_ = uVar48;
                            auVar96._28_4_ = uVar48;
                            auVar96._32_4_ = uVar48;
                            auVar96._36_4_ = uVar48;
                            auVar96._40_4_ = uVar48;
                            auVar96._44_4_ = uVar48;
                            auVar96._48_4_ = uVar48;
                            auVar96._52_4_ = uVar48;
                            auVar96._56_4_ = uVar48;
                            auVar96._60_4_ = uVar48;
                            local_a780 = vfmadd231ps_avx512f(auVar73,auVar81,auVar96);
                            uVar48 = *(undefined4 *)(lVar2 + 8 + uVar47 * 4);
                            auVar97._4_4_ = uVar48;
                            auVar97._0_4_ = uVar48;
                            auVar97._8_4_ = uVar48;
                            auVar97._12_4_ = uVar48;
                            auVar97._16_4_ = uVar48;
                            auVar97._20_4_ = uVar48;
                            auVar97._24_4_ = uVar48;
                            auVar97._28_4_ = uVar48;
                            auVar97._32_4_ = uVar48;
                            auVar97._36_4_ = uVar48;
                            auVar97._40_4_ = uVar48;
                            auVar97._44_4_ = uVar48;
                            auVar97._48_4_ = uVar48;
                            auVar97._52_4_ = uVar48;
                            auVar97._56_4_ = uVar48;
                            auVar97._60_4_ = uVar48;
                            local_a640 = vfmadd231ps_avx512f(auVar80,auVar81,auVar97);
                          }
                          else {
                            if (local_a84c != 0) {
                              lVar2 = *(long *)&pGVar1[2].numPrimitives;
                              uVar57 = (ulong)*(uint *)(lVar51 + uVar56 * 4);
                              uVar53 = local_a820;
                              uVar47 = local_a828;
                              do {
                                auVar60 = *(undefined1 (*) [16])
                                           (*(long *)(lVar2 + (long)*(int *)(local_a800 + uVar47 * 4
                                                                            ) * 0x38) + uVar57 * 4);
                                auVar61 = *(undefined1 (*) [16])
                                           (*(long *)(lVar2 + 0x38 +
                                                     (long)*(int *)(local_a800 + uVar47 * 4) * 0x38)
                                           + uVar57 * 4);
                                *(int *)(local_a600 + uVar47 * 4) = auVar60._0_4_;
                                uVar48 = vextractps_avx(auVar60,1);
                                *(undefined4 *)(local_a5c0 + uVar47 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar60,2);
                                *(undefined4 *)(local_a580 + uVar47 * 4) = uVar48;
                                *(int *)(local_a740 + uVar47 * 4) = auVar61._0_4_;
                                uVar48 = vextractps_avx(auVar61,1);
                                *(undefined4 *)(local_a700 + uVar47 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar61,2);
                                *(undefined4 *)(local_a6c0 + uVar47 * 4) = uVar48;
                                uVar53 = uVar53 ^ 1L << (uVar47 & 0x3f);
                                uVar47 = 0;
                                for (uVar22 = uVar53; (uVar22 & 1) == 0;
                                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                                  uVar47 = uVar47 + 1;
                                }
                              } while (uVar53 != 0);
                            }
                            auVar79 = vsubps_avx512f(auVar66,auVar80);
                            auVar70 = vmulps_avx512f(auVar79,local_a600);
                            auVar71 = vmulps_avx512f(auVar79,local_a5c0);
                            auVar72 = vmulps_avx512f(auVar79,local_a580);
                            auVar73 = vmulps_avx512f(auVar80,local_a740);
                            auVar74 = vmulps_avx512f(auVar80,local_a700);
                            auVar75 = vmulps_avx512f(auVar80,local_a6c0);
                            if (local_a84c != 0) {
                              lVar2 = *(long *)&pGVar1[2].numPrimitives;
                              uVar57 = (ulong)*(uint *)(lVar51 + 0x10 + uVar56 * 4);
                              uVar53 = local_a820;
                              uVar47 = local_a828;
                              do {
                                auVar60 = *(undefined1 (*) [16])
                                           (*(long *)(lVar2 + (long)*(int *)(local_a800 + uVar47 * 4
                                                                            ) * 0x38) + uVar57 * 4);
                                auVar61 = *(undefined1 (*) [16])
                                           (*(long *)(lVar2 + 0x38 +
                                                     (long)*(int *)(local_a800 + uVar47 * 4) * 0x38)
                                           + uVar57 * 4);
                                *(int *)(local_a600 + uVar47 * 4) = auVar60._0_4_;
                                uVar48 = vextractps_avx(auVar60,1);
                                *(undefined4 *)(local_a5c0 + uVar47 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar60,2);
                                *(undefined4 *)(local_a580 + uVar47 * 4) = uVar48;
                                *(int *)(local_a740 + uVar47 * 4) = auVar61._0_4_;
                                uVar48 = vextractps_avx(auVar61,1);
                                *(undefined4 *)(local_a700 + uVar47 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar61,2);
                                *(undefined4 *)(local_a6c0 + uVar47 * 4) = uVar48;
                                uVar53 = uVar53 ^ 1L << (uVar47 & 0x3f);
                                uVar47 = 0;
                                for (uVar22 = uVar53; (uVar22 & 1) == 0;
                                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                                  uVar47 = uVar47 + 1;
                                }
                              } while (uVar53 != 0);
                            }
                            auVar76 = vmulps_avx512f(auVar79,local_a600);
                            auVar77 = vmulps_avx512f(auVar79,local_a5c0);
                            auVar82 = vmulps_avx512f(auVar79,local_a580);
                            auVar83 = vmulps_avx512f(auVar80,local_a740);
                            auVar84 = vmulps_avx512f(auVar80,local_a700);
                            auVar85 = vmulps_avx512f(auVar80,local_a6c0);
                            if (local_a84c != 0) {
                              lVar2 = *(long *)&pGVar1[2].numPrimitives;
                              uVar57 = (ulong)*(uint *)(lVar51 + 0x20 + uVar56 * 4);
                              uVar53 = local_a820;
                              uVar47 = local_a828;
                              do {
                                auVar60 = *(undefined1 (*) [16])
                                           (*(long *)(lVar2 + (long)*(int *)(local_a800 + uVar47 * 4
                                                                            ) * 0x38) + uVar57 * 4);
                                auVar61 = *(undefined1 (*) [16])
                                           (*(long *)(lVar2 + 0x38 +
                                                     (long)*(int *)(local_a800 + uVar47 * 4) * 0x38)
                                           + uVar57 * 4);
                                *(int *)(local_a600 + uVar47 * 4) = auVar60._0_4_;
                                uVar48 = vextractps_avx(auVar60,1);
                                *(undefined4 *)(local_a5c0 + uVar47 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar60,2);
                                *(undefined4 *)(local_a580 + uVar47 * 4) = uVar48;
                                *(int *)(local_a740 + uVar47 * 4) = auVar61._0_4_;
                                uVar48 = vextractps_avx(auVar61,1);
                                *(undefined4 *)(local_a700 + uVar47 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar61,2);
                                *(undefined4 *)(local_a6c0 + uVar47 * 4) = uVar48;
                                uVar53 = uVar53 ^ 1L << (uVar47 & 0x3f);
                                uVar47 = 0;
                                for (uVar22 = uVar53; (uVar22 & 1) == 0;
                                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                                  uVar47 = uVar47 + 1;
                                }
                              } while (uVar53 != 0);
                            }
                            auVar86 = vmulps_avx512f(auVar79,local_a600);
                            auVar87 = vmulps_avx512f(auVar79,local_a5c0);
                            auVar88 = vmulps_avx512f(auVar79,local_a580);
                            auVar89 = vmulps_avx512f(auVar80,local_a740);
                            auVar90 = vmulps_avx512f(auVar80,local_a700);
                            auVar91 = vmulps_avx512f(auVar80,local_a6c0);
                            if (local_a84c != 0) {
                              lVar2 = *(long *)&pGVar1[2].numPrimitives;
                              uVar57 = (ulong)*(uint *)(lVar51 + 0x30 + uVar56 * 4);
                              uVar53 = local_a820;
                              uVar47 = local_a828;
                              do {
                                auVar60 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar2 + (long)*(int *)(
                                                  local_a800 + uVar47 * 4) * 0x38) + uVar57 * 4));
                                auVar61 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar2 + 0x38 +
                                                                        (long)*(int *)(local_a800 +
                                                                                      uVar47 * 4) *
                                                                        0x38) + uVar57 * 4));
                                *(int *)(local_a600 + uVar47 * 4) = auVar60._0_4_;
                                uVar48 = vextractps_avx512f(auVar60,1);
                                *(undefined4 *)(local_a5c0 + uVar47 * 4) = uVar48;
                                uVar48 = vextractps_avx512f(auVar60,2);
                                *(undefined4 *)(local_a580 + uVar47 * 4) = uVar48;
                                *(int *)(local_a740 + uVar47 * 4) = auVar61._0_4_;
                                uVar48 = vextractps_avx512f(auVar61,1);
                                *(undefined4 *)(local_a700 + uVar47 * 4) = uVar48;
                                uVar48 = vextractps_avx512f(auVar61,2);
                                *(undefined4 *)(local_a6c0 + uVar47 * 4) = uVar48;
                                uVar53 = uVar53 ^ 1L << (uVar47 & 0x3f);
                                uVar47 = 0;
                                for (uVar22 = uVar53; (uVar22 & 1) == 0;
                                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                                  uVar47 = uVar47 + 1;
                                }
                              } while (uVar53 != 0);
                            }
                            auVar70 = vaddps_avx512f(auVar70,auVar73);
                            auVar71 = vaddps_avx512f(auVar71,auVar74);
                            auVar72 = vaddps_avx512f(auVar72,auVar75);
                            local_9ec0 = vaddps_avx512f(auVar76,auVar83);
                            local_9f00 = vaddps_avx512f(auVar77,auVar84);
                            local_9f40 = vaddps_avx512f(auVar82,auVar85);
                            local_a300 = vaddps_avx512f(auVar86,auVar89);
                            local_a340 = vaddps_avx512f(auVar87,auVar90);
                            auVar73 = vmulps_avx512f(auVar79,local_a600);
                            auVar74 = vmulps_avx512f(auVar79,local_a5c0);
                            local_a380 = vaddps_avx512f(auVar88,auVar91);
                            auVar75 = vmulps_avx512f(auVar79,local_a580);
                            auVar79 = vmulps_avx512f(auVar80,local_a740);
                            auVar79 = vaddps_avx512f(auVar73,auVar79);
                            auVar73 = vmulps_avx512f(auVar80,local_a700);
                            local_a780 = vaddps_avx512f(auVar74,auVar73);
                            auVar80 = vmulps_avx512f(auVar80,local_a6c0);
                            local_a640 = vaddps_avx512f(auVar75,auVar80);
                          }
                          auVar80 = *(undefined1 (*) [64])ray;
                          auVar73 = *(undefined1 (*) [64])(ray + 0x40);
                          auVar74 = *(undefined1 (*) [64])(ray + 0x80);
                          auVar75 = *(undefined1 (*) [64])(ray + 0x100);
                          auVar76 = *(undefined1 (*) [64])(ray + 0x140);
                          auVar77 = *(undefined1 (*) [64])(ray + 0x180);
                          auVar70 = vsubps_avx512f(auVar70,auVar80);
                          auVar71 = vsubps_avx512f(auVar71,auVar73);
                          auVar72 = vsubps_avx512f(auVar72,auVar74);
                          auVar82 = vsubps_avx512f(local_9ec0,auVar80);
                          auVar83 = vsubps_avx512f(local_9f00,auVar73);
                          auVar84 = vsubps_avx512f(local_9f40,auVar74);
                          auVar80 = vsubps_avx512f(auVar79,auVar80);
                          auVar73 = vsubps_avx512f(local_a780,auVar73);
                          auVar74 = vsubps_avx512f(local_a640,auVar74);
                          auVar85 = vsubps_avx512f(auVar80,auVar70);
                          auVar86 = vsubps_avx512f(auVar73,auVar71);
                          auVar87 = vsubps_avx512f(auVar74,auVar72);
                          auVar88 = vsubps_avx512f(auVar70,auVar82);
                          auVar89 = vsubps_avx512f(auVar71,auVar83);
                          auVar90 = vsubps_avx512f(auVar72,auVar84);
                          auVar91 = vaddps_avx512f(auVar80,auVar70);
                          auVar92 = vaddps_avx512f(auVar73,auVar71);
                          auVar93 = vaddps_avx512f(auVar74,auVar72);
                          auVar94 = vmulps_avx512f(auVar92,auVar87);
                          auVar94 = vfmsub231ps_avx512f(auVar94,auVar86,auVar93);
                          auVar93 = vmulps_avx512f(auVar93,auVar85);
                          auVar93 = vfmsub231ps_avx512f(auVar93,auVar87,auVar91);
                          auVar91 = vmulps_avx512f(auVar91,auVar86);
                          auVar91 = vfmsub231ps_avx512f(auVar91,auVar85,auVar92);
                          auVar91 = vmulps_avx512f(auVar91,auVar77);
                          auVar91 = vfmadd231ps_avx512f(auVar91,auVar76,auVar93);
                          auVar91 = vfmadd231ps_avx512f(auVar91,auVar75,auVar94);
                          auVar92 = vaddps_avx512f(auVar70,auVar82);
                          auVar93 = vaddps_avx512f(auVar71,auVar83);
                          auVar94 = vaddps_avx512f(auVar72,auVar84);
                          auVar95 = vmulps_avx512f(auVar93,auVar90);
                          auVar95 = vfmsub231ps_avx512f(auVar95,auVar89,auVar94);
                          auVar94 = vmulps_avx512f(auVar94,auVar88);
                          auVar94 = vfmsub231ps_avx512f(auVar94,auVar90,auVar92);
                          auVar92 = vmulps_avx512f(auVar92,auVar89);
                          auVar92 = vfmsub231ps_avx512f(auVar92,auVar88,auVar93);
                          auVar93 = vsubps_avx512f(auVar82,auVar80);
                          auVar92 = vmulps_avx512f(auVar92,auVar77);
                          auVar92 = vfmadd231ps_avx512f(auVar92,auVar76,auVar94);
                          auVar94 = vsubps_avx512f(auVar83,auVar73);
                          auVar92 = vfmadd231ps_avx512f(auVar92,auVar75,auVar95);
                          auVar95 = vsubps_avx512f(auVar84,auVar74);
                          auVar80 = vaddps_avx512f(auVar82,auVar80);
                          auVar73 = vaddps_avx512f(auVar83,auVar73);
                          auVar74 = vaddps_avx512f(auVar84,auVar74);
                          auVar82 = vmulps_avx512f(auVar73,auVar95);
                          auVar82 = vfmsub231ps_avx512f(auVar82,auVar94,auVar74);
                          auVar74 = vmulps_avx512f(auVar74,auVar93);
                          auVar74 = vfmsub231ps_avx512f(auVar74,auVar95,auVar80);
                          auVar80 = vmulps_avx512f(auVar80,auVar94);
                          auVar80 = vfmsub231ps_avx512f(auVar80,auVar93,auVar73);
                          auVar80 = vmulps_avx512f(auVar80,auVar77);
                          auVar80 = vfmadd231ps_avx512f(auVar80,auVar76,auVar74);
                          auVar80 = vfmadd231ps_avx512f(auVar80,auVar75,auVar82);
                          auVar73 = vaddps_avx512f(auVar91,auVar92);
                          auVar73 = vaddps_avx512f(auVar80,auVar73);
                          auVar74 = vandps_avx512dq(auVar73,auVar64);
                          auVar81._8_4_ = 0x34000000;
                          auVar81._0_8_ = 0x3400000034000000;
                          auVar81._12_4_ = 0x34000000;
                          auVar81._16_4_ = 0x34000000;
                          auVar81._20_4_ = 0x34000000;
                          auVar81._24_4_ = 0x34000000;
                          auVar81._28_4_ = 0x34000000;
                          auVar81._32_4_ = 0x34000000;
                          auVar81._36_4_ = 0x34000000;
                          auVar81._40_4_ = 0x34000000;
                          auVar81._44_4_ = 0x34000000;
                          auVar81._48_4_ = 0x34000000;
                          auVar81._52_4_ = 0x34000000;
                          auVar81._56_4_ = 0x34000000;
                          auVar81._60_4_ = 0x34000000;
                          auVar82 = vmulps_avx512f(auVar74,auVar81);
                          auVar83 = vminps_avx512f(auVar91,auVar92);
                          auVar83 = vminps_avx512f(auVar83,auVar80);
                          auVar35._8_4_ = 0x80000000;
                          auVar35._0_8_ = 0x8000000080000000;
                          auVar35._12_4_ = 0x80000000;
                          auVar35._16_4_ = 0x80000000;
                          auVar35._20_4_ = 0x80000000;
                          auVar35._24_4_ = 0x80000000;
                          auVar35._28_4_ = 0x80000000;
                          auVar35._32_4_ = 0x80000000;
                          auVar35._36_4_ = 0x80000000;
                          auVar35._40_4_ = 0x80000000;
                          auVar35._44_4_ = 0x80000000;
                          auVar35._48_4_ = 0x80000000;
                          auVar35._52_4_ = 0x80000000;
                          auVar35._56_4_ = 0x80000000;
                          auVar35._60_4_ = 0x80000000;
                          auVar84 = vxorps_avx512dq(auVar82,auVar35);
                          uVar24 = vcmpps_avx512f(auVar83,auVar84,5);
                          auVar83 = vmaxps_avx512f(auVar91,auVar92);
                          auVar80 = vmaxps_avx512f(auVar83,auVar80);
                          uVar25 = vcmpps_avx512f(auVar80,auVar82,2);
                          uVar49 = ((ushort)uVar24 | (ushort)uVar25) & uVar49;
                          if (uVar49 != 0) {
                            local_a680 = auVar79;
                            auVar80 = vmulps_avx512f(auVar89,auVar87);
                            auVar82 = vmulps_avx512f(auVar85,auVar90);
                            auVar83 = vmulps_avx512f(auVar88,auVar86);
                            auVar84 = vmulps_avx512f(auVar94,auVar90);
                            auVar96 = vmulps_avx512f(auVar88,auVar95);
                            auVar97 = vmulps_avx512f(auVar93,auVar89);
                            auVar86 = vfmsub213ps_avx512f(auVar86,auVar90,auVar80);
                            auVar87 = vfmsub213ps_avx512f(auVar87,auVar88,auVar82);
                            auVar85 = vfmsub213ps_avx512f(auVar85,auVar89,auVar83);
                            auVar89 = vfmsub213ps_avx512f(auVar95,auVar89,auVar84);
                            auVar90 = vfmsub213ps_avx512f(auVar93,auVar90,auVar96);
                            auVar88 = vfmsub213ps_avx512f(auVar94,auVar88,auVar97);
                            auVar80 = vandps_avx512dq(auVar80,auVar64);
                            auVar84 = vandps_avx512dq(auVar84,auVar64);
                            uVar47 = vcmpps_avx512f(auVar80,auVar84,1);
                            auVar80 = vandps_avx512dq(auVar82,auVar64);
                            auVar82 = vandps_avx512dq(auVar96,auVar64);
                            uVar53 = vcmpps_avx512f(auVar80,auVar82,1);
                            auVar80 = vandps_avx512dq(auVar83,auVar64);
                            auVar82 = vandps_avx512dq(auVar97,auVar64);
                            uVar57 = vcmpps_avx512f(auVar80,auVar82,1);
                            bVar55 = (bool)((byte)uVar47 & 1);
                            auVar98._0_4_ =
                                 (uint)bVar55 * auVar86._0_4_ | (uint)!bVar55 * auVar89._0_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 1) & 1);
                            auVar98._4_4_ =
                                 (uint)bVar55 * auVar86._4_4_ | (uint)!bVar55 * auVar89._4_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 2) & 1);
                            auVar98._8_4_ =
                                 (uint)bVar55 * auVar86._8_4_ | (uint)!bVar55 * auVar89._8_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 3) & 1);
                            auVar98._12_4_ =
                                 (uint)bVar55 * auVar86._12_4_ | (uint)!bVar55 * auVar89._12_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 4) & 1);
                            auVar98._16_4_ =
                                 (uint)bVar55 * auVar86._16_4_ | (uint)!bVar55 * auVar89._16_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 5) & 1);
                            auVar98._20_4_ =
                                 (uint)bVar55 * auVar86._20_4_ | (uint)!bVar55 * auVar89._20_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 6) & 1);
                            auVar98._24_4_ =
                                 (uint)bVar55 * auVar86._24_4_ | (uint)!bVar55 * auVar89._24_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 7) & 1);
                            auVar98._28_4_ =
                                 (uint)bVar55 * auVar86._28_4_ | (uint)!bVar55 * auVar89._28_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 8) & 1);
                            auVar98._32_4_ =
                                 (uint)bVar55 * auVar86._32_4_ | (uint)!bVar55 * auVar89._32_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 9) & 1);
                            auVar98._36_4_ =
                                 (uint)bVar55 * auVar86._36_4_ | (uint)!bVar55 * auVar89._36_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 10) & 1);
                            auVar98._40_4_ =
                                 (uint)bVar55 * auVar86._40_4_ | (uint)!bVar55 * auVar89._40_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 0xb) & 1);
                            auVar98._44_4_ =
                                 (uint)bVar55 * auVar86._44_4_ | (uint)!bVar55 * auVar89._44_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 0xc) & 1);
                            auVar98._48_4_ =
                                 (uint)bVar55 * auVar86._48_4_ | (uint)!bVar55 * auVar89._48_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 0xd) & 1);
                            auVar98._52_4_ =
                                 (uint)bVar55 * auVar86._52_4_ | (uint)!bVar55 * auVar89._52_4_;
                            bVar55 = (bool)((byte)(uVar47 >> 0xe) & 1);
                            auVar98._56_4_ =
                                 (uint)bVar55 * auVar86._56_4_ | (uint)!bVar55 * auVar89._56_4_;
                            bVar55 = SUB81(uVar47 >> 0xf,0);
                            auVar98._60_4_ =
                                 (uint)bVar55 * auVar86._60_4_ | (uint)!bVar55 * auVar89._60_4_;
                            bVar55 = (bool)((byte)uVar53 & 1);
                            auVar99._0_4_ =
                                 (uint)bVar55 * auVar87._0_4_ | (uint)!bVar55 * auVar90._0_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 1) & 1);
                            auVar99._4_4_ =
                                 (uint)bVar55 * auVar87._4_4_ | (uint)!bVar55 * auVar90._4_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 2) & 1);
                            auVar99._8_4_ =
                                 (uint)bVar55 * auVar87._8_4_ | (uint)!bVar55 * auVar90._8_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 3) & 1);
                            auVar99._12_4_ =
                                 (uint)bVar55 * auVar87._12_4_ | (uint)!bVar55 * auVar90._12_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 4) & 1);
                            auVar99._16_4_ =
                                 (uint)bVar55 * auVar87._16_4_ | (uint)!bVar55 * auVar90._16_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 5) & 1);
                            auVar99._20_4_ =
                                 (uint)bVar55 * auVar87._20_4_ | (uint)!bVar55 * auVar90._20_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 6) & 1);
                            auVar99._24_4_ =
                                 (uint)bVar55 * auVar87._24_4_ | (uint)!bVar55 * auVar90._24_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 7) & 1);
                            auVar99._28_4_ =
                                 (uint)bVar55 * auVar87._28_4_ | (uint)!bVar55 * auVar90._28_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 8) & 1);
                            auVar99._32_4_ =
                                 (uint)bVar55 * auVar87._32_4_ | (uint)!bVar55 * auVar90._32_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 9) & 1);
                            auVar99._36_4_ =
                                 (uint)bVar55 * auVar87._36_4_ | (uint)!bVar55 * auVar90._36_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 10) & 1);
                            auVar99._40_4_ =
                                 (uint)bVar55 * auVar87._40_4_ | (uint)!bVar55 * auVar90._40_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 0xb) & 1);
                            auVar99._44_4_ =
                                 (uint)bVar55 * auVar87._44_4_ | (uint)!bVar55 * auVar90._44_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 0xc) & 1);
                            auVar99._48_4_ =
                                 (uint)bVar55 * auVar87._48_4_ | (uint)!bVar55 * auVar90._48_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 0xd) & 1);
                            auVar99._52_4_ =
                                 (uint)bVar55 * auVar87._52_4_ | (uint)!bVar55 * auVar90._52_4_;
                            bVar55 = (bool)((byte)(uVar53 >> 0xe) & 1);
                            auVar99._56_4_ =
                                 (uint)bVar55 * auVar87._56_4_ | (uint)!bVar55 * auVar90._56_4_;
                            bVar55 = SUB81(uVar53 >> 0xf,0);
                            auVar99._60_4_ =
                                 (uint)bVar55 * auVar87._60_4_ | (uint)!bVar55 * auVar90._60_4_;
                            bVar55 = (bool)((byte)uVar57 & 1);
                            auVar100._0_4_ =
                                 (uint)bVar55 * auVar85._0_4_ | (uint)!bVar55 * auVar88._0_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 1) & 1);
                            auVar100._4_4_ =
                                 (uint)bVar55 * auVar85._4_4_ | (uint)!bVar55 * auVar88._4_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 2) & 1);
                            auVar100._8_4_ =
                                 (uint)bVar55 * auVar85._8_4_ | (uint)!bVar55 * auVar88._8_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 3) & 1);
                            auVar100._12_4_ =
                                 (uint)bVar55 * auVar85._12_4_ | (uint)!bVar55 * auVar88._12_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 4) & 1);
                            auVar100._16_4_ =
                                 (uint)bVar55 * auVar85._16_4_ | (uint)!bVar55 * auVar88._16_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 5) & 1);
                            auVar100._20_4_ =
                                 (uint)bVar55 * auVar85._20_4_ | (uint)!bVar55 * auVar88._20_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 6) & 1);
                            auVar100._24_4_ =
                                 (uint)bVar55 * auVar85._24_4_ | (uint)!bVar55 * auVar88._24_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 7) & 1);
                            auVar100._28_4_ =
                                 (uint)bVar55 * auVar85._28_4_ | (uint)!bVar55 * auVar88._28_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 8) & 1);
                            auVar100._32_4_ =
                                 (uint)bVar55 * auVar85._32_4_ | (uint)!bVar55 * auVar88._32_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 9) & 1);
                            auVar100._36_4_ =
                                 (uint)bVar55 * auVar85._36_4_ | (uint)!bVar55 * auVar88._36_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 10) & 1);
                            auVar100._40_4_ =
                                 (uint)bVar55 * auVar85._40_4_ | (uint)!bVar55 * auVar88._40_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 0xb) & 1);
                            auVar100._44_4_ =
                                 (uint)bVar55 * auVar85._44_4_ | (uint)!bVar55 * auVar88._44_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 0xc) & 1);
                            auVar100._48_4_ =
                                 (uint)bVar55 * auVar85._48_4_ | (uint)!bVar55 * auVar88._48_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 0xd) & 1);
                            auVar100._52_4_ =
                                 (uint)bVar55 * auVar85._52_4_ | (uint)!bVar55 * auVar88._52_4_;
                            bVar55 = (bool)((byte)(uVar57 >> 0xe) & 1);
                            auVar100._56_4_ =
                                 (uint)bVar55 * auVar85._56_4_ | (uint)!bVar55 * auVar88._56_4_;
                            bVar55 = SUB81(uVar57 >> 0xf,0);
                            auVar100._60_4_ =
                                 (uint)bVar55 * auVar85._60_4_ | (uint)!bVar55 * auVar88._60_4_;
                            auVar80 = vmulps_avx512f(auVar77,auVar100);
                            auVar80 = vfmadd213ps_avx512f(auVar76,auVar99,auVar80);
                            auVar80 = vfmadd213ps_avx512f(auVar75,auVar98,auVar80);
                            auVar75 = vaddps_avx512f(auVar80,auVar80);
                            auVar80 = vmulps_avx512f(auVar72,auVar100);
                            auVar80 = vfmadd213ps_avx512f(auVar71,auVar99,auVar80);
                            auVar80 = vfmadd213ps_avx512f(auVar70,auVar98,auVar80);
                            auVar70 = vrcp14ps_avx512f(auVar75);
                            auVar80 = vaddps_avx512f(auVar80,auVar80);
                            auVar71 = vfnmadd213ps_avx512f(auVar70,auVar75,auVar66);
                            auVar70 = vfmadd132ps_avx512f(auVar71,auVar70,auVar70);
                            auVar70 = vmulps_avx512f(auVar80,auVar70);
                            auVar80 = *(undefined1 (*) [64])(ray + 0x200);
                            uVar24 = vcmpps_avx512f(auVar70,auVar80,2);
                            uVar25 = vcmpps_avx512f(auVar70,*(undefined1 (*) [64])(ray + 0xc0),0xd);
                            uVar26 = vcmpps_avx512f(auVar75,auVar69,4);
                            uVar49 = uVar49 & (ushort)uVar24 & (ushort)uVar25 & (ushort)uVar26;
                            if (uVar49 != 0) {
                              auVar79 = vpbroadcastd_avx512f(ZEXT416(pGVar1->mask));
                              uVar24 = vptestmd_avx512f(auVar79,*(undefined1 (*) [64])(ray + 0x240))
                              ;
                              uVar49 = uVar49 & (ushort)uVar24;
                              uVar47 = (ulong)uVar49;
                              auVar79 = local_a680;
                              if (uVar49 != 0) {
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  uVar53 = vcmpps_avx512f(auVar74,auVar65,5);
                                  auVar79 = vrcp14ps_avx512f(auVar73);
                                  auVar71 = vfnmadd213ps_avx512f(auVar73,auVar79,auVar66);
                                  auVar79 = vfmadd132ps_avx512f(auVar71,auVar79,auVar79);
                                  auVar104._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * auVar79._4_4_;
                                  auVar104._0_4_ = (uint)((byte)uVar53 & 1) * auVar79._0_4_;
                                  auVar104._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * auVar79._8_4_;
                                  auVar104._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * auVar79._12_4_
                                  ;
                                  auVar104._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * auVar79._16_4_
                                  ;
                                  auVar104._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * auVar79._20_4_
                                  ;
                                  auVar104._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * auVar79._24_4_
                                  ;
                                  auVar104._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * auVar79._28_4_
                                  ;
                                  auVar104._32_4_ = (uint)((byte)(uVar53 >> 8) & 1) * auVar79._32_4_
                                  ;
                                  auVar104._36_4_ = (uint)((byte)(uVar53 >> 9) & 1) * auVar79._36_4_
                                  ;
                                  auVar104._40_4_ =
                                       (uint)((byte)(uVar53 >> 10) & 1) * auVar79._40_4_;
                                  auVar104._44_4_ =
                                       (uint)((byte)(uVar53 >> 0xb) & 1) * auVar79._44_4_;
                                  auVar104._48_4_ =
                                       (uint)((byte)(uVar53 >> 0xc) & 1) * auVar79._48_4_;
                                  auVar104._52_4_ =
                                       (uint)((byte)(uVar53 >> 0xd) & 1) * auVar79._52_4_;
                                  auVar104._56_4_ =
                                       (uint)((byte)(uVar53 >> 0xe) & 1) * auVar79._56_4_;
                                  auVar104._60_4_ = (uint)(byte)(uVar53 >> 0xf) * auVar79._60_4_;
                                  auVar79 = vmulps_avx512f(auVar91,auVar104);
                                  local_a540 = vminps_avx512f(auVar79,auVar66);
                                  auVar79 = vmulps_avx512f(auVar92,auVar104);
                                  local_a500 = vminps_avx512f(auVar79,auVar66);
                                  pRVar4 = context->user;
                                  auVar79 = vpbroadcastd_avx512f();
                                  auVar71 = vpbroadcastd_avx512f();
                                  local_a600 = auVar98;
                                  local_a5c0 = auVar99;
                                  local_a580 = auVar100;
                                  local_a4c0 = vmovdqa64_avx512f(auVar71);
                                  local_a480 = vmovdqa64_avx512f(auVar79);
                                  auVar62 = vpcmpeqd_avx2(local_a540._0_32_,local_a540._0_32_);
                                  local_a798[3] = auVar62;
                                  local_a798[2] = auVar62;
                                  local_a798[1] = auVar62;
                                  *local_a798 = auVar62;
                                  local_a440 = vbroadcastss_avx512f(ZEXT416(pRVar4->instID[0]));
                                  local_a400 = vbroadcastss_avx512f(ZEXT416(pRVar4->instPrimID[0]));
                                  auVar79 = vblendmps_avx512f(auVar80,auVar70);
                                  bVar55 = (bool)((byte)uVar49 & 1);
                                  bVar6 = (bool)((byte)(uVar49 >> 1) & 1);
                                  bVar7 = (bool)((byte)(uVar49 >> 2) & 1);
                                  bVar8 = (bool)((byte)(uVar49 >> 3) & 1);
                                  bVar9 = (bool)((byte)(uVar49 >> 4) & 1);
                                  bVar10 = (bool)((byte)(uVar49 >> 5) & 1);
                                  bVar11 = (bool)((byte)(uVar49 >> 6) & 1);
                                  bVar12 = (bool)((byte)(uVar49 >> 7) & 1);
                                  bVar13 = (byte)(uVar49 >> 8);
                                  bVar14 = (bool)(bVar13 >> 1 & 1);
                                  bVar15 = (bool)(bVar13 >> 2 & 1);
                                  bVar16 = (bool)(bVar13 >> 3 & 1);
                                  bVar17 = (bool)(bVar13 >> 4 & 1);
                                  bVar18 = (bool)(bVar13 >> 5 & 1);
                                  bVar19 = (bool)(bVar13 >> 6 & 1);
                                  *(uint *)(ray + 0x200) =
                                       (uint)bVar55 * auVar79._0_4_ |
                                       (uint)!bVar55 * local_a400._0_4_;
                                  *(uint *)(ray + 0x204) =
                                       (uint)bVar6 * auVar79._4_4_ | (uint)!bVar6 * local_a400._4_4_
                                  ;
                                  *(uint *)(ray + 0x208) =
                                       (uint)bVar7 * auVar79._8_4_ | (uint)!bVar7 * local_a400._8_4_
                                  ;
                                  *(uint *)(ray + 0x20c) =
                                       (uint)bVar8 * auVar79._12_4_ |
                                       (uint)!bVar8 * local_a400._12_4_;
                                  *(uint *)(ray + 0x210) =
                                       (uint)bVar9 * auVar79._16_4_ |
                                       (uint)!bVar9 * local_a400._16_4_;
                                  *(uint *)(ray + 0x214) =
                                       (uint)bVar10 * auVar79._20_4_ |
                                       (uint)!bVar10 * local_a400._20_4_;
                                  *(uint *)(ray + 0x218) =
                                       (uint)bVar11 * auVar79._24_4_ |
                                       (uint)!bVar11 * local_a400._24_4_;
                                  *(uint *)(ray + 0x21c) =
                                       (uint)bVar12 * auVar79._28_4_ |
                                       (uint)!bVar12 * local_a400._28_4_;
                                  *(uint *)(ray + 0x220) =
                                       (uint)(bVar13 & 1) * auVar79._32_4_ |
                                       (uint)!(bool)(bVar13 & 1) * local_a400._32_4_;
                                  *(uint *)(ray + 0x224) =
                                       (uint)bVar14 * auVar79._36_4_ |
                                       (uint)!bVar14 * local_a400._36_4_;
                                  *(uint *)(ray + 0x228) =
                                       (uint)bVar15 * auVar79._40_4_ |
                                       (uint)!bVar15 * local_a400._40_4_;
                                  *(uint *)(ray + 0x22c) =
                                       (uint)bVar16 * auVar79._44_4_ |
                                       (uint)!bVar16 * local_a400._44_4_;
                                  *(uint *)(ray + 0x230) =
                                       (uint)bVar17 * auVar79._48_4_ |
                                       (uint)!bVar17 * local_a400._48_4_;
                                  *(uint *)(ray + 0x234) =
                                       (uint)bVar18 * auVar79._52_4_ |
                                       (uint)!bVar18 * local_a400._52_4_;
                                  *(uint *)(ray + 0x238) =
                                       (uint)bVar19 * auVar79._56_4_ |
                                       (uint)!bVar19 * local_a400._56_4_;
                                  *(uint *)(ray + 0x23c) =
                                       (uint)(uVar49 >> 0xf) * auVar79._60_4_ |
                                       (uint)!(bool)(bVar13 >> 7) * local_a400._60_4_;
                                  auVar79 = vpmovm2d_avx512dq(uVar47);
                                  local_a740 = vmovdqa64_avx512f(auVar79);
                                  local_a800._8_8_ = pGVar1->userPtr;
                                  local_a800._0_8_ = local_a740;
                                  pRStack_a7f0 = context->user;
                                  pRStack_a7e8 = ray;
                                  puStack_a7e0 = local_a600;
                                  auStack_a7d4 = auVar121._44_20_;
                                  uStack_a7d8 = 0x10;
                                  local_a3c0 = auVar80;
                                  if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    (*pGVar1->occlusionFilterN)
                                              ((RTCFilterFunctionNArguments *)local_a800);
                                    auVar59 = vxorps_avx512vl(auVar59,auVar59);
                                    auVar69 = ZEXT1664(auVar59);
                                    auVar63 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                                    auVar67 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                    auVar68 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                    auVar66 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                    auVar65 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
                                    auVar64 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                  }
                                  auVar59 = auVar69._0_16_;
                                  auVar121 = vmovdqa64_avx512f(local_a740);
                                  uVar47 = vptestmd_avx512f(auVar121,auVar121);
                                  if ((short)uVar47 != 0) {
                                    p_Var5 = context->args->filter;
                                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var5)((RTCFilterFunctionNArguments *)local_a800);
                                      auVar59 = vxorps_avx512vl(auVar59,auVar59);
                                      auVar69 = ZEXT1664(auVar59);
                                      auVar63 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                                      auVar67 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                      auVar68 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                      auVar66 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                      auVar65 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
                                      auVar64 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                    }
                                    auVar121 = vmovdqa64_avx512f(local_a740);
                                    uVar47 = vptestmd_avx512f(auVar121,auVar121);
                                    auVar121 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                    bVar55 = (bool)((byte)uVar47 & 1);
                                    bVar6 = (bool)((byte)(uVar47 >> 1) & 1);
                                    bVar7 = (bool)((byte)(uVar47 >> 2) & 1);
                                    bVar8 = (bool)((byte)(uVar47 >> 3) & 1);
                                    bVar9 = (bool)((byte)(uVar47 >> 4) & 1);
                                    bVar10 = (bool)((byte)(uVar47 >> 5) & 1);
                                    bVar11 = (bool)((byte)(uVar47 >> 6) & 1);
                                    bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
                                    bVar14 = (bool)((byte)(uVar47 >> 8) & 1);
                                    bVar15 = (bool)((byte)(uVar47 >> 9) & 1);
                                    bVar16 = (bool)((byte)(uVar47 >> 10) & 1);
                                    bVar17 = (bool)((byte)(uVar47 >> 0xb) & 1);
                                    bVar18 = (bool)((byte)(uVar47 >> 0xc) & 1);
                                    bVar19 = (bool)((byte)(uVar47 >> 0xd) & 1);
                                    bVar20 = (bool)((byte)(uVar47 >> 0xe) & 1);
                                    bVar21 = SUB81(uVar47 >> 0xf,0);
                                    *(uint *)(pRStack_a7e8 + 0x200) =
                                         (uint)bVar55 * auVar121._0_4_ |
                                         (uint)!bVar55 * *(int *)(pRStack_a7e8 + 0x200);
                                    *(uint *)(pRStack_a7e8 + 0x204) =
                                         (uint)bVar6 * auVar121._4_4_ |
                                         (uint)!bVar6 * *(int *)(pRStack_a7e8 + 0x204);
                                    *(uint *)(pRStack_a7e8 + 0x208) =
                                         (uint)bVar7 * auVar121._8_4_ |
                                         (uint)!bVar7 * *(int *)(pRStack_a7e8 + 0x208);
                                    *(uint *)(pRStack_a7e8 + 0x20c) =
                                         (uint)bVar8 * auVar121._12_4_ |
                                         (uint)!bVar8 * *(int *)(pRStack_a7e8 + 0x20c);
                                    *(uint *)(pRStack_a7e8 + 0x210) =
                                         (uint)bVar9 * auVar121._16_4_ |
                                         (uint)!bVar9 * *(int *)(pRStack_a7e8 + 0x210);
                                    *(uint *)(pRStack_a7e8 + 0x214) =
                                         (uint)bVar10 * auVar121._20_4_ |
                                         (uint)!bVar10 * *(int *)(pRStack_a7e8 + 0x214);
                                    *(uint *)(pRStack_a7e8 + 0x218) =
                                         (uint)bVar11 * auVar121._24_4_ |
                                         (uint)!bVar11 * *(int *)(pRStack_a7e8 + 0x218);
                                    *(uint *)(pRStack_a7e8 + 0x21c) =
                                         (uint)bVar12 * auVar121._28_4_ |
                                         (uint)!bVar12 * *(int *)(pRStack_a7e8 + 0x21c);
                                    *(uint *)(pRStack_a7e8 + 0x220) =
                                         (uint)bVar14 * auVar121._32_4_ |
                                         (uint)!bVar14 * *(int *)(pRStack_a7e8 + 0x220);
                                    *(uint *)(pRStack_a7e8 + 0x224) =
                                         (uint)bVar15 * auVar121._36_4_ |
                                         (uint)!bVar15 * *(int *)(pRStack_a7e8 + 0x224);
                                    *(uint *)(pRStack_a7e8 + 0x228) =
                                         (uint)bVar16 * auVar121._40_4_ |
                                         (uint)!bVar16 * *(int *)(pRStack_a7e8 + 0x228);
                                    *(uint *)(pRStack_a7e8 + 0x22c) =
                                         (uint)bVar17 * auVar121._44_4_ |
                                         (uint)!bVar17 * *(int *)(pRStack_a7e8 + 0x22c);
                                    *(uint *)(pRStack_a7e8 + 0x230) =
                                         (uint)bVar18 * auVar121._48_4_ |
                                         (uint)!bVar18 * *(int *)(pRStack_a7e8 + 0x230);
                                    *(uint *)(pRStack_a7e8 + 0x234) =
                                         (uint)bVar19 * auVar121._52_4_ |
                                         (uint)!bVar19 * *(int *)(pRStack_a7e8 + 0x234);
                                    *(uint *)(pRStack_a7e8 + 0x238) =
                                         (uint)bVar20 * auVar121._56_4_ |
                                         (uint)!bVar20 * *(int *)(pRStack_a7e8 + 0x238);
                                    *(uint *)(pRStack_a7e8 + 0x23c) =
                                         (uint)bVar21 * auVar121._60_4_ |
                                         (uint)!bVar21 * *(int *)(pRStack_a7e8 + 0x23c);
                                  }
                                  bVar55 = (bool)((byte)uVar47 & 1);
                                  bVar6 = (bool)((byte)(uVar47 >> 1) & 1);
                                  bVar7 = (bool)((byte)(uVar47 >> 2) & 1);
                                  bVar8 = (bool)((byte)(uVar47 >> 3) & 1);
                                  bVar9 = (bool)((byte)(uVar47 >> 4) & 1);
                                  bVar10 = (bool)((byte)(uVar47 >> 5) & 1);
                                  bVar11 = (bool)((byte)(uVar47 >> 6) & 1);
                                  bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
                                  bVar14 = (bool)((byte)(uVar47 >> 8) & 1);
                                  bVar15 = (bool)((byte)(uVar47 >> 9) & 1);
                                  bVar16 = (bool)((byte)(uVar47 >> 10) & 1);
                                  bVar17 = (bool)((byte)(uVar47 >> 0xb) & 1);
                                  bVar18 = (bool)((byte)(uVar47 >> 0xc) & 1);
                                  bVar19 = (bool)((byte)(uVar47 >> 0xd) & 1);
                                  bVar20 = (bool)((byte)(uVar47 >> 0xe) & 1);
                                  bVar21 = SUB81(uVar47 >> 0xf,0);
                                  *(uint *)local_a810 =
                                       (uint)bVar55 * *(int *)local_a810 |
                                       (uint)!bVar55 * local_a3c0._0_4_;
                                  *(uint *)(local_a810 + 4) =
                                       (uint)bVar6 * *(int *)(local_a810 + 4) |
                                       (uint)!bVar6 * local_a3c0._4_4_;
                                  *(uint *)(local_a810 + 8) =
                                       (uint)bVar7 * *(int *)(local_a810 + 8) |
                                       (uint)!bVar7 * local_a3c0._8_4_;
                                  *(uint *)(local_a810 + 0xc) =
                                       (uint)bVar8 * *(int *)(local_a810 + 0xc) |
                                       (uint)!bVar8 * local_a3c0._12_4_;
                                  *(uint *)(local_a810 + 0x10) =
                                       (uint)bVar9 * *(int *)(local_a810 + 0x10) |
                                       (uint)!bVar9 * local_a3c0._16_4_;
                                  *(uint *)(local_a810 + 0x14) =
                                       (uint)bVar10 * *(int *)(local_a810 + 0x14) |
                                       (uint)!bVar10 * local_a3c0._20_4_;
                                  *(uint *)(local_a810 + 0x18) =
                                       (uint)bVar11 * *(int *)(local_a810 + 0x18) |
                                       (uint)!bVar11 * local_a3c0._24_4_;
                                  *(uint *)(local_a810 + 0x1c) =
                                       (uint)bVar12 * *(int *)(local_a810 + 0x1c) |
                                       (uint)!bVar12 * local_a3c0._28_4_;
                                  *(uint *)(local_a810 + 0x20) =
                                       (uint)bVar14 * *(int *)(local_a810 + 0x20) |
                                       (uint)!bVar14 * local_a3c0._32_4_;
                                  *(uint *)(local_a810 + 0x24) =
                                       (uint)bVar15 * *(int *)(local_a810 + 0x24) |
                                       (uint)!bVar15 * local_a3c0._36_4_;
                                  *(uint *)(local_a810 + 0x28) =
                                       (uint)bVar16 * *(int *)(local_a810 + 0x28) |
                                       (uint)!bVar16 * local_a3c0._40_4_;
                                  *(uint *)(local_a810 + 0x2c) =
                                       (uint)bVar17 * *(int *)(local_a810 + 0x2c) |
                                       (uint)!bVar17 * local_a3c0._44_4_;
                                  *(uint *)(local_a810 + 0x30) =
                                       (uint)bVar18 * *(int *)(local_a810 + 0x30) |
                                       (uint)!bVar18 * local_a3c0._48_4_;
                                  *(uint *)(local_a810 + 0x34) =
                                       (uint)bVar19 * *(int *)(local_a810 + 0x34) |
                                       (uint)!bVar19 * local_a3c0._52_4_;
                                  *(uint *)(local_a810 + 0x38) =
                                       (uint)bVar20 * *(int *)(local_a810 + 0x38) |
                                       (uint)!bVar20 * local_a3c0._56_4_;
                                  *(uint *)(local_a810 + 0x3c) =
                                       (uint)bVar21 * *(int *)(local_a810 + 0x3c) |
                                       (uint)!bVar21 * local_a3c0._60_4_;
                                }
                                uVar46 = (ulong)(~(uint)uVar47 & (uint)uVar46);
                                auVar79 = local_a680;
                              }
                            }
                          }
                          auVar80 = _local_a800;
                          if ((ushort)uVar46 == 0) {
                            bVar55 = false;
                            auVar121 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                          }
                          else {
                            auVar121 = *(undefined1 (*) [64])ray;
                            auVar69 = *(undefined1 (*) [64])(ray + 0x40);
                            auVar70 = *(undefined1 (*) [64])(ray + 0x80);
                            auVar71 = *(undefined1 (*) [64])(ray + 0x100);
                            auVar72 = *(undefined1 (*) [64])(ray + 0x140);
                            auVar73 = *(undefined1 (*) [64])(ray + 0x180);
                            auVar74 = vsubps_avx512f(local_a300,auVar121);
                            auVar75 = vsubps_avx512f(local_a340,auVar69);
                            auVar76 = vsubps_avx512f(local_a380,auVar70);
                            auVar79 = vsubps_avx512f(auVar79,auVar121);
                            auVar77 = vsubps_avx512f(local_a780,auVar69);
                            auVar82 = vsubps_avx512f(local_a640,auVar70);
                            auVar121 = vsubps_avx512f(local_9ec0,auVar121);
                            auVar69 = vsubps_avx512f(local_9f00,auVar69);
                            auVar70 = vsubps_avx512f(local_9f40,auVar70);
                            auVar83 = vsubps_avx512f(auVar121,auVar74);
                            auVar84 = vsubps_avx512f(auVar69,auVar75);
                            auVar85 = vsubps_avx512f(auVar70,auVar76);
                            auVar86 = vsubps_avx512f(auVar74,auVar79);
                            auVar87 = vsubps_avx512f(auVar75,auVar77);
                            auVar88 = vsubps_avx512f(auVar76,auVar82);
                            auVar89 = vsubps_avx512f(auVar79,auVar121);
                            auVar90 = vsubps_avx512f(auVar77,auVar69);
                            auVar91 = vsubps_avx512f(auVar82,auVar70);
                            auVar92 = vaddps_avx512f(auVar121,auVar74);
                            auVar93 = vaddps_avx512f(auVar69,auVar75);
                            auVar94 = vaddps_avx512f(auVar70,auVar76);
                            auVar95 = vmulps_avx512f(auVar93,auVar85);
                            auVar95 = vfmsub231ps_avx512f(auVar95,auVar84,auVar94);
                            auVar94 = vmulps_avx512f(auVar94,auVar83);
                            auVar94 = vfmsub231ps_avx512f(auVar94,auVar85,auVar92);
                            auVar92 = vmulps_avx512f(auVar92,auVar84);
                            auVar92 = vfmsub231ps_avx512f(auVar92,auVar83,auVar93);
                            auVar92 = vmulps_avx512f(auVar92,auVar73);
                            auVar92 = vfmadd231ps_avx512f(auVar92,auVar72,auVar94);
                            auVar92 = vfmadd231ps_avx512f(auVar92,auVar71,auVar95);
                            auVar93 = vaddps_avx512f(auVar74,auVar79);
                            auVar94 = vaddps_avx512f(auVar75,auVar77);
                            auVar95 = vaddps_avx512f(auVar76,auVar82);
                            auVar96 = vmulps_avx512f(auVar94,auVar88);
                            auVar96 = vfmsub231ps_avx512f(auVar96,auVar87,auVar95);
                            auVar95 = vmulps_avx512f(auVar95,auVar86);
                            auVar95 = vfmsub231ps_avx512f(auVar95,auVar88,auVar93);
                            auVar93 = vmulps_avx512f(auVar93,auVar87);
                            auVar93 = vfmsub231ps_avx512f(auVar93,auVar86,auVar94);
                            auVar93 = vmulps_avx512f(auVar93,auVar73);
                            auVar93 = vfmadd231ps_avx512f(auVar93,auVar72,auVar95);
                            auVar93 = vfmadd231ps_avx512f(auVar93,auVar71,auVar96);
                            auVar121 = vaddps_avx512f(auVar79,auVar121);
                            auVar69 = vaddps_avx512f(auVar77,auVar69);
                            auVar79 = vaddps_avx512f(auVar82,auVar70);
                            auVar70 = vmulps_avx512f(auVar69,auVar91);
                            auVar70 = vfmsub231ps_avx512f(auVar70,auVar90,auVar79);
                            auVar79 = vmulps_avx512f(auVar79,auVar89);
                            auVar79 = vfmsub231ps_avx512f(auVar79,auVar91,auVar121);
                            auVar121 = vmulps_avx512f(auVar121,auVar90);
                            auVar121 = vfmsub231ps_avx512f(auVar121,auVar89,auVar69);
                            auVar121 = vmulps_avx512f(auVar121,auVar73);
                            auVar121 = vfmadd231ps_avx512f(auVar121,auVar72,auVar79);
                            auVar69 = vfmadd231ps_avx512f(auVar121,auVar71,auVar70);
                            auVar121 = vaddps_avx512f(auVar92,auVar93);
                            auVar79 = vaddps_avx512f(auVar69,auVar121);
                            auVar70 = vandps_avx512dq(auVar79,auVar64);
                            auVar121._8_4_ = 0x34000000;
                            auVar121._0_8_ = 0x3400000034000000;
                            auVar121._12_4_ = 0x34000000;
                            auVar121._16_4_ = 0x34000000;
                            auVar121._20_4_ = 0x34000000;
                            auVar121._24_4_ = 0x34000000;
                            auVar121._28_4_ = 0x34000000;
                            auVar121._32_4_ = 0x34000000;
                            auVar121._36_4_ = 0x34000000;
                            auVar121._40_4_ = 0x34000000;
                            auVar121._44_4_ = 0x34000000;
                            auVar121._48_4_ = 0x34000000;
                            auVar121._52_4_ = 0x34000000;
                            auVar121._56_4_ = 0x34000000;
                            auVar121._60_4_ = 0x34000000;
                            auVar121 = vmulps_avx512f(auVar70,auVar121);
                            auVar77 = vminps_avx512f(auVar92,auVar93);
                            auVar77 = vminps_avx512f(auVar77,auVar69);
                            auVar36._8_4_ = 0x80000000;
                            auVar36._0_8_ = 0x8000000080000000;
                            auVar36._12_4_ = 0x80000000;
                            auVar36._16_4_ = 0x80000000;
                            auVar36._20_4_ = 0x80000000;
                            auVar36._24_4_ = 0x80000000;
                            auVar36._28_4_ = 0x80000000;
                            auVar36._32_4_ = 0x80000000;
                            auVar36._36_4_ = 0x80000000;
                            auVar36._40_4_ = 0x80000000;
                            auVar36._44_4_ = 0x80000000;
                            auVar36._48_4_ = 0x80000000;
                            auVar36._52_4_ = 0x80000000;
                            auVar36._56_4_ = 0x80000000;
                            auVar36._60_4_ = 0x80000000;
                            auVar82 = vxorps_avx512dq(auVar121,auVar36);
                            uVar24 = vcmpps_avx512f(auVar77,auVar82,5);
                            auVar77 = vmaxps_avx512f(auVar92,auVar93);
                            auVar69 = vmaxps_avx512f(auVar77,auVar69);
                            uVar25 = vcmpps_avx512f(auVar69,auVar121,2);
                            uVar49 = ((ushort)uVar24 | (ushort)uVar25) & (ushort)uVar46;
                            auVar59 = auVar96._0_16_;
                            if (uVar49 == 0) {
                              auVar121 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                              auVar59 = vxorps_avx512vl(auVar59,auVar59);
                              auVar69 = ZEXT1664(auVar59);
                            }
                            else {
                              auVar121 = vmulps_avx512f(auVar87,auVar85);
                              auVar69 = vmulps_avx512f(auVar83,auVar88);
                              auVar77 = vmulps_avx512f(auVar86,auVar84);
                              auVar82 = vmulps_avx512f(auVar90,auVar88);
                              auVar94 = vmulps_avx512f(auVar86,auVar91);
                              auVar95 = vmulps_avx512f(auVar89,auVar87);
                              auVar84 = vfmsub213ps_avx512f(auVar84,auVar88,auVar121);
                              auVar85 = vfmsub213ps_avx512f(auVar85,auVar86,auVar69);
                              auVar83 = vfmsub213ps_avx512f(auVar83,auVar87,auVar77);
                              auVar87 = vfmsub213ps_avx512f(auVar91,auVar87,auVar82);
                              auVar88 = vfmsub213ps_avx512f(auVar89,auVar88,auVar94);
                              auVar86 = vfmsub213ps_avx512f(auVar90,auVar86,auVar95);
                              auVar121 = vandps_avx512dq(auVar121,auVar64);
                              auVar82 = vandps_avx512dq(auVar82,auVar64);
                              uVar47 = vcmpps_avx512f(auVar121,auVar82,1);
                              auVar121 = vandps_avx512dq(auVar69,auVar64);
                              auVar69 = vandps_avx512dq(auVar94,auVar64);
                              uVar53 = vcmpps_avx512f(auVar121,auVar69,1);
                              auVar121 = vandps_avx512dq(auVar77,auVar64);
                              auVar69 = vandps_avx512dq(auVar95,auVar64);
                              uVar57 = vcmpps_avx512f(auVar121,auVar69,1);
                              bVar55 = (bool)((byte)uVar47 & 1);
                              auVar101._0_4_ =
                                   (uint)bVar55 * auVar84._0_4_ | (uint)!bVar55 * auVar87._0_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 1) & 1);
                              auVar101._4_4_ =
                                   (uint)bVar55 * auVar84._4_4_ | (uint)!bVar55 * auVar87._4_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 2) & 1);
                              auVar101._8_4_ =
                                   (uint)bVar55 * auVar84._8_4_ | (uint)!bVar55 * auVar87._8_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 3) & 1);
                              auVar101._12_4_ =
                                   (uint)bVar55 * auVar84._12_4_ | (uint)!bVar55 * auVar87._12_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 4) & 1);
                              auVar101._16_4_ =
                                   (uint)bVar55 * auVar84._16_4_ | (uint)!bVar55 * auVar87._16_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 5) & 1);
                              auVar101._20_4_ =
                                   (uint)bVar55 * auVar84._20_4_ | (uint)!bVar55 * auVar87._20_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 6) & 1);
                              auVar101._24_4_ =
                                   (uint)bVar55 * auVar84._24_4_ | (uint)!bVar55 * auVar87._24_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 7) & 1);
                              auVar101._28_4_ =
                                   (uint)bVar55 * auVar84._28_4_ | (uint)!bVar55 * auVar87._28_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 8) & 1);
                              auVar101._32_4_ =
                                   (uint)bVar55 * auVar84._32_4_ | (uint)!bVar55 * auVar87._32_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 9) & 1);
                              auVar101._36_4_ =
                                   (uint)bVar55 * auVar84._36_4_ | (uint)!bVar55 * auVar87._36_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 10) & 1);
                              auVar101._40_4_ =
                                   (uint)bVar55 * auVar84._40_4_ | (uint)!bVar55 * auVar87._40_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 0xb) & 1);
                              auVar101._44_4_ =
                                   (uint)bVar55 * auVar84._44_4_ | (uint)!bVar55 * auVar87._44_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 0xc) & 1);
                              auVar101._48_4_ =
                                   (uint)bVar55 * auVar84._48_4_ | (uint)!bVar55 * auVar87._48_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 0xd) & 1);
                              auVar101._52_4_ =
                                   (uint)bVar55 * auVar84._52_4_ | (uint)!bVar55 * auVar87._52_4_;
                              bVar55 = (bool)((byte)(uVar47 >> 0xe) & 1);
                              auVar101._56_4_ =
                                   (uint)bVar55 * auVar84._56_4_ | (uint)!bVar55 * auVar87._56_4_;
                              bVar55 = SUB81(uVar47 >> 0xf,0);
                              auVar101._60_4_ =
                                   (uint)bVar55 * auVar84._60_4_ | (uint)!bVar55 * auVar87._60_4_;
                              bVar55 = (bool)((byte)uVar53 & 1);
                              auVar62._0_4_ =
                                   (uint)bVar55 * auVar85._0_4_ | (uint)!bVar55 * auVar88._0_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 1) & 1);
                              auVar62._4_4_ =
                                   (uint)bVar55 * auVar85._4_4_ | (uint)!bVar55 * auVar88._4_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 2) & 1);
                              auVar62._8_4_ =
                                   (uint)bVar55 * auVar85._8_4_ | (uint)!bVar55 * auVar88._8_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 3) & 1);
                              auVar62._12_4_ =
                                   (uint)bVar55 * auVar85._12_4_ | (uint)!bVar55 * auVar88._12_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 4) & 1);
                              auVar62._16_4_ =
                                   (uint)bVar55 * auVar85._16_4_ | (uint)!bVar55 * auVar88._16_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 5) & 1);
                              auVar62._20_4_ =
                                   (uint)bVar55 * auVar85._20_4_ | (uint)!bVar55 * auVar88._20_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 6) & 1);
                              auVar62._24_4_ =
                                   (uint)bVar55 * auVar85._24_4_ | (uint)!bVar55 * auVar88._24_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 7) & 1);
                              auVar62._28_4_ =
                                   (uint)bVar55 * auVar85._28_4_ | (uint)!bVar55 * auVar88._28_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 8) & 1);
                              auVar102._32_4_ =
                                   (uint)bVar55 * auVar85._32_4_ | (uint)!bVar55 * auVar88._32_4_;
                              auVar102._0_32_ = auVar62;
                              bVar55 = (bool)((byte)(uVar53 >> 9) & 1);
                              auVar102._36_4_ =
                                   (uint)bVar55 * auVar85._36_4_ | (uint)!bVar55 * auVar88._36_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 10) & 1);
                              auVar102._40_4_ =
                                   (uint)bVar55 * auVar85._40_4_ | (uint)!bVar55 * auVar88._40_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 0xb) & 1);
                              auVar102._44_4_ =
                                   (uint)bVar55 * auVar85._44_4_ | (uint)!bVar55 * auVar88._44_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 0xc) & 1);
                              auVar102._48_4_ =
                                   (uint)bVar55 * auVar85._48_4_ | (uint)!bVar55 * auVar88._48_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 0xd) & 1);
                              auVar102._52_4_ =
                                   (uint)bVar55 * auVar85._52_4_ | (uint)!bVar55 * auVar88._52_4_;
                              bVar55 = (bool)((byte)(uVar53 >> 0xe) & 1);
                              auVar102._56_4_ =
                                   (uint)bVar55 * auVar85._56_4_ | (uint)!bVar55 * auVar88._56_4_;
                              bVar55 = SUB81(uVar53 >> 0xf,0);
                              auVar102._60_4_ =
                                   (uint)bVar55 * auVar85._60_4_ | (uint)!bVar55 * auVar88._60_4_;
                              bVar55 = (bool)((byte)uVar57 & 1);
                              auVar103._0_4_ =
                                   (uint)bVar55 * auVar83._0_4_ | (uint)!bVar55 * auVar86._0_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 1) & 1);
                              auVar103._4_4_ =
                                   (uint)bVar55 * auVar83._4_4_ | (uint)!bVar55 * auVar86._4_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 2) & 1);
                              auVar103._8_4_ =
                                   (uint)bVar55 * auVar83._8_4_ | (uint)!bVar55 * auVar86._8_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 3) & 1);
                              auVar103._12_4_ =
                                   (uint)bVar55 * auVar83._12_4_ | (uint)!bVar55 * auVar86._12_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 4) & 1);
                              auVar103._16_4_ =
                                   (uint)bVar55 * auVar83._16_4_ | (uint)!bVar55 * auVar86._16_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 5) & 1);
                              auVar103._20_4_ =
                                   (uint)bVar55 * auVar83._20_4_ | (uint)!bVar55 * auVar86._20_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 6) & 1);
                              auVar103._24_4_ =
                                   (uint)bVar55 * auVar83._24_4_ | (uint)!bVar55 * auVar86._24_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 7) & 1);
                              auVar103._28_4_ =
                                   (uint)bVar55 * auVar83._28_4_ | (uint)!bVar55 * auVar86._28_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 8) & 1);
                              auVar103._32_4_ =
                                   (uint)bVar55 * auVar83._32_4_ | (uint)!bVar55 * auVar86._32_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 9) & 1);
                              auVar103._36_4_ =
                                   (uint)bVar55 * auVar83._36_4_ | (uint)!bVar55 * auVar86._36_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 10) & 1);
                              auVar103._40_4_ =
                                   (uint)bVar55 * auVar83._40_4_ | (uint)!bVar55 * auVar86._40_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 0xb) & 1);
                              auVar103._44_4_ =
                                   (uint)bVar55 * auVar83._44_4_ | (uint)!bVar55 * auVar86._44_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 0xc) & 1);
                              auVar103._48_4_ =
                                   (uint)bVar55 * auVar83._48_4_ | (uint)!bVar55 * auVar86._48_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 0xd) & 1);
                              auVar103._52_4_ =
                                   (uint)bVar55 * auVar83._52_4_ | (uint)!bVar55 * auVar86._52_4_;
                              bVar55 = (bool)((byte)(uVar57 >> 0xe) & 1);
                              auVar103._56_4_ =
                                   (uint)bVar55 * auVar83._56_4_ | (uint)!bVar55 * auVar86._56_4_;
                              bVar55 = SUB81(uVar57 >> 0xf,0);
                              auVar103._60_4_ =
                                   (uint)bVar55 * auVar83._60_4_ | (uint)!bVar55 * auVar86._60_4_;
                              auVar121 = vmulps_avx512f(auVar73,auVar103);
                              auVar121 = vfmadd213ps_avx512f(auVar72,auVar102,auVar121);
                              auVar121 = vfmadd213ps_avx512f(auVar71,auVar101,auVar121);
                              auVar121 = vaddps_avx512f(auVar121,auVar121);
                              auVar69 = vmulps_avx512f(auVar76,auVar103);
                              auVar69 = vfmadd213ps_avx512f(auVar75,auVar102,auVar69);
                              auVar69 = vfmadd213ps_avx512f(auVar74,auVar101,auVar69);
                              auVar71 = vrcp14ps_avx512f(auVar121);
                              auVar69 = vaddps_avx512f(auVar69,auVar69);
                              auVar72 = vfnmadd213ps_avx512f(auVar71,auVar121,auVar66);
                              auVar71 = vfmadd132ps_avx512f(auVar72,auVar71,auVar71);
                              auVar71 = vmulps_avx512f(auVar69,auVar71);
                              local_a780 = *(undefined1 (*) [64])(ray + 0x200);
                              uVar24 = vcmpps_avx512f(auVar71,local_a780,2);
                              uVar25 = vcmpps_avx512f(auVar71,*(undefined1 (*) [64])(ray + 0xc0),0xd
                                                     );
                              auVar59 = vxorps_avx512vl(auVar59,auVar59);
                              auVar69 = ZEXT1664(auVar59);
                              uVar26 = vcmpps_avx512f(auVar121,auVar69,4);
                              uVar49 = uVar49 & (ushort)uVar24 & (ushort)uVar25 & (ushort)uVar26;
                              if (uVar49 == 0) {
                                auVar121 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                              }
                              else {
                                pGVar1 = (context->scene->geometries).items
                                         [*(uint *)(lVar51 + 0x40 + uVar56 * 4)].ptr;
                                auVar121 = vpbroadcastd_avx512f(ZEXT416(pGVar1->mask));
                                uVar24 = vptestmd_avx512f(auVar121,*(undefined1 (*) [64])
                                                                    (ray + 0x240));
                                uVar49 = uVar49 & (ushort)uVar24;
                                uVar45 = (uint)uVar49;
                                auVar121 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                                if (uVar49 != 0) {
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar72 = vrcp14ps_avx512f(auVar79);
                                    uVar47 = vcmpps_avx512f(auVar70,auVar65,5);
                                    auVar79 = vfnmadd213ps_avx512f(auVar79,auVar72,auVar66);
                                    auVar79 = vfmadd132ps_avx512f(auVar79,auVar72,auVar72);
                                    auVar105._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar79._4_4_
                                    ;
                                    auVar105._0_4_ = (uint)((byte)uVar47 & 1) * auVar79._0_4_;
                                    auVar105._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar79._8_4_
                                    ;
                                    auVar105._12_4_ =
                                         (uint)((byte)(uVar47 >> 3) & 1) * auVar79._12_4_;
                                    auVar105._16_4_ =
                                         (uint)((byte)(uVar47 >> 4) & 1) * auVar79._16_4_;
                                    auVar105._20_4_ =
                                         (uint)((byte)(uVar47 >> 5) & 1) * auVar79._20_4_;
                                    auVar105._24_4_ =
                                         (uint)((byte)(uVar47 >> 6) & 1) * auVar79._24_4_;
                                    auVar105._28_4_ =
                                         (uint)((byte)(uVar47 >> 7) & 1) * auVar79._28_4_;
                                    auVar105._32_4_ =
                                         (uint)((byte)(uVar47 >> 8) & 1) * auVar79._32_4_;
                                    auVar105._36_4_ =
                                         (uint)((byte)(uVar47 >> 9) & 1) * auVar79._36_4_;
                                    auVar105._40_4_ =
                                         (uint)((byte)(uVar47 >> 10) & 1) * auVar79._40_4_;
                                    auVar105._44_4_ =
                                         (uint)((byte)(uVar47 >> 0xb) & 1) * auVar79._44_4_;
                                    auVar105._48_4_ =
                                         (uint)((byte)(uVar47 >> 0xc) & 1) * auVar79._48_4_;
                                    auVar105._52_4_ =
                                         (uint)((byte)(uVar47 >> 0xd) & 1) * auVar79._52_4_;
                                    auVar105._56_4_ =
                                         (uint)((byte)(uVar47 >> 0xe) & 1) * auVar79._56_4_;
                                    auVar105._60_4_ = (uint)(byte)(uVar47 >> 0xf) * auVar79._60_4_;
                                    auVar79 = vmulps_avx512f(auVar92,auVar105);
                                    auVar79 = vminps_avx512f(auVar79,auVar66);
                                    auVar70 = vmulps_avx512f(auVar93,auVar105);
                                    auVar70 = vminps_avx512f(auVar70,auVar66);
                                    local_a540 = vsubps_avx512f(auVar66,auVar79);
                                    local_a500 = vsubps_avx512f(auVar66,auVar70);
                                    pRVar4 = context->user;
                                    auVar79 = vpbroadcastd_avx512f();
                                    auVar70 = vpbroadcastd_avx512f();
                                    local_a600 = auVar101;
                                    local_a5c0 = auVar102;
                                    local_a580 = auVar103;
                                    local_a4c0 = vmovdqa64_avx512f(auVar70);
                                    local_a480 = vmovdqa64_avx512f(auVar79);
                                    auVar62 = vpcmpeqd_avx2(auVar62,auVar62);
                                    local_a798[3] = auVar62;
                                    local_a798[2] = auVar62;
                                    local_a798[1] = auVar62;
                                    *local_a798 = auVar62;
                                    local_a440 = vbroadcastss_avx512f(ZEXT416(pRVar4->instID[0]));
                                    local_a400 = vbroadcastss_avx512f
                                                           (ZEXT416(pRVar4->instPrimID[0]));
                                    auVar79 = vblendmps_avx512f(local_a780,auVar71);
                                    bVar55 = (bool)((byte)uVar49 & 1);
                                    bVar6 = (bool)((byte)(uVar49 >> 1) & 1);
                                    bVar7 = (bool)((byte)(uVar49 >> 2) & 1);
                                    bVar8 = (bool)((byte)(uVar49 >> 3) & 1);
                                    bVar9 = (bool)((byte)(uVar49 >> 4) & 1);
                                    bVar10 = (bool)((byte)(uVar49 >> 5) & 1);
                                    bVar11 = (bool)((byte)(uVar49 >> 6) & 1);
                                    bVar12 = (bool)((byte)(uVar49 >> 7) & 1);
                                    bVar13 = (byte)(uVar49 >> 8);
                                    bVar14 = (bool)(bVar13 >> 1 & 1);
                                    bVar15 = (bool)(bVar13 >> 2 & 1);
                                    bVar16 = (bool)(bVar13 >> 3 & 1);
                                    bVar17 = (bool)(bVar13 >> 4 & 1);
                                    bVar18 = (bool)(bVar13 >> 5 & 1);
                                    bVar19 = (bool)(bVar13 >> 6 & 1);
                                    *(uint *)(ray + 0x200) =
                                         (uint)bVar55 * auVar79._0_4_ |
                                         (uint)!bVar55 * local_a400._0_4_;
                                    *(uint *)(ray + 0x204) =
                                         (uint)bVar6 * auVar79._4_4_ |
                                         (uint)!bVar6 * local_a400._4_4_;
                                    *(uint *)(ray + 0x208) =
                                         (uint)bVar7 * auVar79._8_4_ |
                                         (uint)!bVar7 * local_a400._8_4_;
                                    *(uint *)(ray + 0x20c) =
                                         (uint)bVar8 * auVar79._12_4_ |
                                         (uint)!bVar8 * local_a400._12_4_;
                                    *(uint *)(ray + 0x210) =
                                         (uint)bVar9 * auVar79._16_4_ |
                                         (uint)!bVar9 * local_a400._16_4_;
                                    *(uint *)(ray + 0x214) =
                                         (uint)bVar10 * auVar79._20_4_ |
                                         (uint)!bVar10 * local_a400._20_4_;
                                    *(uint *)(ray + 0x218) =
                                         (uint)bVar11 * auVar79._24_4_ |
                                         (uint)!bVar11 * local_a400._24_4_;
                                    *(uint *)(ray + 0x21c) =
                                         (uint)bVar12 * auVar79._28_4_ |
                                         (uint)!bVar12 * local_a400._28_4_;
                                    *(uint *)(ray + 0x220) =
                                         (uint)(bVar13 & 1) * auVar79._32_4_ |
                                         (uint)!(bool)(bVar13 & 1) * local_a400._32_4_;
                                    *(uint *)(ray + 0x224) =
                                         (uint)bVar14 * auVar79._36_4_ |
                                         (uint)!bVar14 * local_a400._36_4_;
                                    *(uint *)(ray + 0x228) =
                                         (uint)bVar15 * auVar79._40_4_ |
                                         (uint)!bVar15 * local_a400._40_4_;
                                    *(uint *)(ray + 0x22c) =
                                         (uint)bVar16 * auVar79._44_4_ |
                                         (uint)!bVar16 * local_a400._44_4_;
                                    *(uint *)(ray + 0x230) =
                                         (uint)bVar17 * auVar79._48_4_ |
                                         (uint)!bVar17 * local_a400._48_4_;
                                    *(uint *)(ray + 0x234) =
                                         (uint)bVar18 * auVar79._52_4_ |
                                         (uint)!bVar18 * local_a400._52_4_;
                                    *(uint *)(ray + 0x238) =
                                         (uint)bVar19 * auVar79._56_4_ |
                                         (uint)!bVar19 * local_a400._56_4_;
                                    *(uint *)(ray + 0x23c) =
                                         (uint)(uVar49 >> 0xf) * auVar79._60_4_ |
                                         (uint)!(bool)(bVar13 >> 7) * local_a400._60_4_;
                                    auVar79 = vpmovm2d_avx512dq((ulong)uVar45);
                                    local_a740 = vmovdqa64_avx512f(auVar79);
                                    local_a800._8_8_ = pGVar1->userPtr;
                                    local_a800._0_8_ = local_a740;
                                    pRStack_a7f0 = context->user;
                                    pRStack_a7e8 = ray;
                                    puStack_a7e0 = local_a600;
                                    auStack_a7d4 = auVar80._44_20_;
                                    uStack_a7d8 = 0x10;
                                    if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      (*pGVar1->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)local_a800);
                                      auVar59 = vxorps_avx512vl(auVar59,auVar59);
                                      auVar69 = ZEXT1664(auVar59);
                                      auVar121 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                                      auVar63 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                                      auVar67 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                      auVar68 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                      auVar66 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                      auVar65 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
                                      auVar64 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                    }
                                    auVar59 = auVar69._0_16_;
                                    auVar79 = vmovdqa64_avx512f(local_a740);
                                    uVar47 = vptestmd_avx512f(auVar79,auVar79);
                                    if ((short)uVar47 != 0) {
                                      p_Var5 = context->args->filter;
                                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                                        (*p_Var5)((RTCFilterFunctionNArguments *)local_a800);
                                        auVar59 = vxorps_avx512vl(auVar59,auVar59);
                                        auVar69 = ZEXT1664(auVar59);
                                        auVar121 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                                        auVar63 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                                        auVar67 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                        auVar68 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                        auVar66 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                        auVar65 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
                                        auVar64 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                      }
                                      auVar79 = vmovdqa64_avx512f(local_a740);
                                      uVar47 = vptestmd_avx512f(auVar79,auVar79);
                                      auVar79 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                      bVar55 = (bool)((byte)uVar47 & 1);
                                      bVar6 = (bool)((byte)(uVar47 >> 1) & 1);
                                      bVar7 = (bool)((byte)(uVar47 >> 2) & 1);
                                      bVar8 = (bool)((byte)(uVar47 >> 3) & 1);
                                      bVar9 = (bool)((byte)(uVar47 >> 4) & 1);
                                      bVar10 = (bool)((byte)(uVar47 >> 5) & 1);
                                      bVar11 = (bool)((byte)(uVar47 >> 6) & 1);
                                      bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
                                      bVar14 = (bool)((byte)(uVar47 >> 8) & 1);
                                      bVar15 = (bool)((byte)(uVar47 >> 9) & 1);
                                      bVar16 = (bool)((byte)(uVar47 >> 10) & 1);
                                      bVar17 = (bool)((byte)(uVar47 >> 0xb) & 1);
                                      bVar18 = (bool)((byte)(uVar47 >> 0xc) & 1);
                                      bVar19 = (bool)((byte)(uVar47 >> 0xd) & 1);
                                      bVar20 = (bool)((byte)(uVar47 >> 0xe) & 1);
                                      bVar21 = SUB81(uVar47 >> 0xf,0);
                                      *(uint *)(pRStack_a7e8 + 0x200) =
                                           (uint)bVar55 * auVar79._0_4_ |
                                           (uint)!bVar55 * *(int *)(pRStack_a7e8 + 0x200);
                                      *(uint *)(pRStack_a7e8 + 0x204) =
                                           (uint)bVar6 * auVar79._4_4_ |
                                           (uint)!bVar6 * *(int *)(pRStack_a7e8 + 0x204);
                                      *(uint *)(pRStack_a7e8 + 0x208) =
                                           (uint)bVar7 * auVar79._8_4_ |
                                           (uint)!bVar7 * *(int *)(pRStack_a7e8 + 0x208);
                                      *(uint *)(pRStack_a7e8 + 0x20c) =
                                           (uint)bVar8 * auVar79._12_4_ |
                                           (uint)!bVar8 * *(int *)(pRStack_a7e8 + 0x20c);
                                      *(uint *)(pRStack_a7e8 + 0x210) =
                                           (uint)bVar9 * auVar79._16_4_ |
                                           (uint)!bVar9 * *(int *)(pRStack_a7e8 + 0x210);
                                      *(uint *)(pRStack_a7e8 + 0x214) =
                                           (uint)bVar10 * auVar79._20_4_ |
                                           (uint)!bVar10 * *(int *)(pRStack_a7e8 + 0x214);
                                      *(uint *)(pRStack_a7e8 + 0x218) =
                                           (uint)bVar11 * auVar79._24_4_ |
                                           (uint)!bVar11 * *(int *)(pRStack_a7e8 + 0x218);
                                      *(uint *)(pRStack_a7e8 + 0x21c) =
                                           (uint)bVar12 * auVar79._28_4_ |
                                           (uint)!bVar12 * *(int *)(pRStack_a7e8 + 0x21c);
                                      *(uint *)(pRStack_a7e8 + 0x220) =
                                           (uint)bVar14 * auVar79._32_4_ |
                                           (uint)!bVar14 * *(int *)(pRStack_a7e8 + 0x220);
                                      *(uint *)(pRStack_a7e8 + 0x224) =
                                           (uint)bVar15 * auVar79._36_4_ |
                                           (uint)!bVar15 * *(int *)(pRStack_a7e8 + 0x224);
                                      *(uint *)(pRStack_a7e8 + 0x228) =
                                           (uint)bVar16 * auVar79._40_4_ |
                                           (uint)!bVar16 * *(int *)(pRStack_a7e8 + 0x228);
                                      *(uint *)(pRStack_a7e8 + 0x22c) =
                                           (uint)bVar17 * auVar79._44_4_ |
                                           (uint)!bVar17 * *(int *)(pRStack_a7e8 + 0x22c);
                                      *(uint *)(pRStack_a7e8 + 0x230) =
                                           (uint)bVar18 * auVar79._48_4_ |
                                           (uint)!bVar18 * *(int *)(pRStack_a7e8 + 0x230);
                                      *(uint *)(pRStack_a7e8 + 0x234) =
                                           (uint)bVar19 * auVar79._52_4_ |
                                           (uint)!bVar19 * *(int *)(pRStack_a7e8 + 0x234);
                                      *(uint *)(pRStack_a7e8 + 0x238) =
                                           (uint)bVar20 * auVar79._56_4_ |
                                           (uint)!bVar20 * *(int *)(pRStack_a7e8 + 0x238);
                                      *(uint *)(pRStack_a7e8 + 0x23c) =
                                           (uint)bVar21 * auVar79._60_4_ |
                                           (uint)!bVar21 * *(int *)(pRStack_a7e8 + 0x23c);
                                    }
                                    uVar45 = (uint)uVar47;
                                    bVar55 = (bool)((byte)uVar47 & 1);
                                    bVar6 = (bool)((byte)(uVar47 >> 1) & 1);
                                    bVar7 = (bool)((byte)(uVar47 >> 2) & 1);
                                    bVar8 = (bool)((byte)(uVar47 >> 3) & 1);
                                    bVar9 = (bool)((byte)(uVar47 >> 4) & 1);
                                    bVar10 = (bool)((byte)(uVar47 >> 5) & 1);
                                    bVar11 = (bool)((byte)(uVar47 >> 6) & 1);
                                    bVar12 = (bool)((byte)(uVar47 >> 7) & 1);
                                    bVar14 = (bool)((byte)(uVar47 >> 8) & 1);
                                    bVar15 = (bool)((byte)(uVar47 >> 9) & 1);
                                    bVar16 = (bool)((byte)(uVar47 >> 10) & 1);
                                    bVar17 = (bool)((byte)(uVar47 >> 0xb) & 1);
                                    bVar18 = (bool)((byte)(uVar47 >> 0xc) & 1);
                                    bVar19 = (bool)((byte)(uVar47 >> 0xd) & 1);
                                    bVar20 = (bool)((byte)(uVar47 >> 0xe) & 1);
                                    bVar21 = SUB81(uVar47 >> 0xf,0);
                                    *(uint *)local_a810 =
                                         (uint)bVar55 * *(int *)local_a810 |
                                         (uint)!bVar55 * local_a780._0_4_;
                                    *(uint *)(local_a810 + 4) =
                                         (uint)bVar6 * *(int *)(local_a810 + 4) |
                                         (uint)!bVar6 * local_a780._4_4_;
                                    *(uint *)(local_a810 + 8) =
                                         (uint)bVar7 * *(int *)(local_a810 + 8) |
                                         (uint)!bVar7 * local_a780._8_4_;
                                    *(uint *)(local_a810 + 0xc) =
                                         (uint)bVar8 * *(int *)(local_a810 + 0xc) |
                                         (uint)!bVar8 * local_a780._12_4_;
                                    *(uint *)(local_a810 + 0x10) =
                                         (uint)bVar9 * *(int *)(local_a810 + 0x10) |
                                         (uint)!bVar9 * local_a780._16_4_;
                                    *(uint *)(local_a810 + 0x14) =
                                         (uint)bVar10 * *(int *)(local_a810 + 0x14) |
                                         (uint)!bVar10 * local_a780._20_4_;
                                    *(uint *)(local_a810 + 0x18) =
                                         (uint)bVar11 * *(int *)(local_a810 + 0x18) |
                                         (uint)!bVar11 * local_a780._24_4_;
                                    *(uint *)(local_a810 + 0x1c) =
                                         (uint)bVar12 * *(int *)(local_a810 + 0x1c) |
                                         (uint)!bVar12 * local_a780._28_4_;
                                    *(uint *)(local_a810 + 0x20) =
                                         (uint)bVar14 * *(int *)(local_a810 + 0x20) |
                                         (uint)!bVar14 * local_a780._32_4_;
                                    *(uint *)(local_a810 + 0x24) =
                                         (uint)bVar15 * *(int *)(local_a810 + 0x24) |
                                         (uint)!bVar15 * local_a780._36_4_;
                                    *(uint *)(local_a810 + 0x28) =
                                         (uint)bVar16 * *(int *)(local_a810 + 0x28) |
                                         (uint)!bVar16 * local_a780._40_4_;
                                    *(uint *)(local_a810 + 0x2c) =
                                         (uint)bVar17 * *(int *)(local_a810 + 0x2c) |
                                         (uint)!bVar17 * local_a780._44_4_;
                                    *(uint *)(local_a810 + 0x30) =
                                         (uint)bVar18 * *(int *)(local_a810 + 0x30) |
                                         (uint)!bVar18 * local_a780._48_4_;
                                    *(uint *)(local_a810 + 0x34) =
                                         (uint)bVar19 * *(int *)(local_a810 + 0x34) |
                                         (uint)!bVar19 * local_a780._52_4_;
                                    *(uint *)(local_a810 + 0x38) =
                                         (uint)bVar20 * *(int *)(local_a810 + 0x38) |
                                         (uint)!bVar20 * local_a780._56_4_;
                                    *(uint *)(local_a810 + 0x3c) =
                                         (uint)bVar21 * *(int *)(local_a810 + 0x3c) |
                                         (uint)!bVar21 * local_a780._60_4_;
                                  }
                                  uVar46 = (ulong)(~uVar45 & (uint)uVar46);
                                }
                              }
                            }
                            bVar55 = (short)uVar46 != 0;
                          }
                          uVar49 = (ushort)uVar46;
                          if ((!bVar55) || (bVar55 = 2 < uVar56, uVar56 = uVar56 + 1, bVar55))
                          break;
                        }
                        uVar44 = (uint)(local_a84c & uVar49);
                      } while (((local_a84c & uVar49) != 0) &&
                              (uVar56 = local_a788 + 1, uVar56 < local_a790));
                      uVar44 = ~uVar44;
                    }
                    local_a864 = local_a864 | uVar44;
                    if ((short)local_a864 == -1) goto LAB_008e6b42;
                    auVar79 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar55 = (bool)((byte)local_a864 & 1);
                    bVar6 = (bool)((byte)(local_a864 >> 1) & 1);
                    bVar7 = (bool)((byte)(local_a864 >> 2) & 1);
                    bVar8 = (bool)((byte)(local_a864 >> 3) & 1);
                    bVar9 = (bool)((byte)(local_a864 >> 4) & 1);
                    bVar10 = (bool)((byte)(local_a864 >> 5) & 1);
                    bVar11 = (bool)((byte)(local_a864 >> 6) & 1);
                    bVar12 = (bool)((byte)(local_a864 >> 7) & 1);
                    bVar14 = (bool)((byte)(local_a864 >> 8) & 1);
                    bVar15 = (bool)((byte)(local_a864 >> 9) & 1);
                    bVar16 = (bool)((byte)(local_a864 >> 10) & 1);
                    bVar17 = (bool)((byte)(local_a864 >> 0xb) & 1);
                    bVar18 = (bool)((byte)(local_a864 >> 0xc) & 1);
                    bVar19 = (bool)((byte)(local_a864 >> 0xd) & 1);
                    bVar20 = (bool)((byte)(local_a864 >> 0xe) & 1);
                    bVar21 = (bool)((byte)(local_a864 >> 0xf) & 1);
                    local_9f80 = (uint)bVar55 * auVar79._0_4_ | !bVar55 * local_9f80;
                    uStack_9f7c = (uint)bVar6 * auVar79._4_4_ | !bVar6 * uStack_9f7c;
                    uStack_9f78 = (uint)bVar7 * auVar79._8_4_ | !bVar7 * uStack_9f78;
                    uStack_9f74 = (uint)bVar8 * auVar79._12_4_ | !bVar8 * uStack_9f74;
                    uStack_9f70 = (uint)bVar9 * auVar79._16_4_ | !bVar9 * uStack_9f70;
                    uStack_9f6c = (uint)bVar10 * auVar79._20_4_ | !bVar10 * uStack_9f6c;
                    uStack_9f68 = (uint)bVar11 * auVar79._24_4_ | !bVar11 * uStack_9f68;
                    uStack_9f64 = (uint)bVar12 * auVar79._28_4_ | !bVar12 * uStack_9f64;
                    uStack_9f60 = (uint)bVar14 * auVar79._32_4_ | !bVar14 * uStack_9f60;
                    uStack_9f5c = (uint)bVar15 * auVar79._36_4_ | !bVar15 * uStack_9f5c;
                    uStack_9f58 = (uint)bVar16 * auVar79._40_4_ | !bVar16 * uStack_9f58;
                    uStack_9f54 = (uint)bVar17 * auVar79._44_4_ | !bVar17 * uStack_9f54;
                    uStack_9f50 = (uint)bVar18 * auVar79._48_4_ | !bVar18 * uStack_9f50;
                    uStack_9f4c = (uint)bVar19 * auVar79._52_4_ | !bVar19 * uStack_9f4c;
                    uStack_9f48 = (uint)bVar20 * auVar79._56_4_ | !bVar20 * uStack_9f48;
                    uStack_9f44 = (uint)bVar21 * auVar79._60_4_ | !bVar21 * uStack_9f44;
                    iVar58 = 0;
                    break;
                  }
                  goto LAB_008e6b53;
                }
                auVar41._4_4_ = uStack_9f7c;
                auVar41._0_4_ = local_9f80;
                auVar41._8_4_ = uStack_9f78;
                auVar41._12_4_ = uStack_9f74;
                auVar41._16_4_ = uStack_9f70;
                auVar41._20_4_ = uStack_9f6c;
                auVar41._24_4_ = uStack_9f68;
                auVar41._28_4_ = uStack_9f64;
                auVar41._32_4_ = uStack_9f60;
                auVar41._36_4_ = uStack_9f5c;
                auVar41._40_4_ = uStack_9f58;
                auVar41._44_4_ = uStack_9f54;
                auVar41._48_4_ = uStack_9f50;
                auVar41._52_4_ = uStack_9f4c;
                auVar41._56_4_ = uStack_9f48;
                auVar41._60_4_ = uStack_9f44;
                uVar46 = root.ptr & 0xfffffffffffffff0;
                uVar56 = 0;
                uVar47 = 8;
                auVar79 = auVar67;
                do {
                  uVar53 = *(ulong *)(uVar46 + uVar56 * 8);
                  root.ptr = uVar47;
                  auVar78 = auVar79;
                  if (uVar53 != 8) {
                    auVar70 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar46 + 0x100 + uVar56 * 4)));
                    auVar80 = *(undefined1 (*) [64])(ray + 0x1c0);
                    uVar48 = *(undefined4 *)(uVar46 + 0x40 + uVar56 * 4);
                    auVar27._4_4_ = uVar48;
                    auVar27._0_4_ = uVar48;
                    auVar27._8_4_ = uVar48;
                    auVar27._12_4_ = uVar48;
                    auVar27._16_4_ = uVar48;
                    auVar27._20_4_ = uVar48;
                    auVar27._24_4_ = uVar48;
                    auVar27._28_4_ = uVar48;
                    auVar27._32_4_ = uVar48;
                    auVar27._36_4_ = uVar48;
                    auVar27._40_4_ = uVar48;
                    auVar27._44_4_ = uVar48;
                    auVar27._48_4_ = uVar48;
                    auVar27._52_4_ = uVar48;
                    auVar27._56_4_ = uVar48;
                    auVar27._60_4_ = uVar48;
                    auVar70 = vfmadd213ps_avx512f(auVar70,auVar80,auVar27);
                    auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar46 + 0x140 + uVar56 * 4)));
                    uVar48 = *(undefined4 *)(uVar46 + 0x80 + uVar56 * 4);
                    auVar28._4_4_ = uVar48;
                    auVar28._0_4_ = uVar48;
                    auVar28._8_4_ = uVar48;
                    auVar28._12_4_ = uVar48;
                    auVar28._16_4_ = uVar48;
                    auVar28._20_4_ = uVar48;
                    auVar28._24_4_ = uVar48;
                    auVar28._28_4_ = uVar48;
                    auVar28._32_4_ = uVar48;
                    auVar28._36_4_ = uVar48;
                    auVar28._40_4_ = uVar48;
                    auVar28._44_4_ = uVar48;
                    auVar28._48_4_ = uVar48;
                    auVar28._52_4_ = uVar48;
                    auVar28._56_4_ = uVar48;
                    auVar28._60_4_ = uVar48;
                    auVar71 = vfmadd213ps_avx512f(auVar71,auVar80,auVar28);
                    auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar46 + 0x180 + uVar56 * 4)));
                    uVar48 = *(undefined4 *)(uVar46 + 0xc0 + uVar56 * 4);
                    auVar29._4_4_ = uVar48;
                    auVar29._0_4_ = uVar48;
                    auVar29._8_4_ = uVar48;
                    auVar29._12_4_ = uVar48;
                    auVar29._16_4_ = uVar48;
                    auVar29._20_4_ = uVar48;
                    auVar29._24_4_ = uVar48;
                    auVar29._28_4_ = uVar48;
                    auVar29._32_4_ = uVar48;
                    auVar29._36_4_ = uVar48;
                    auVar29._40_4_ = uVar48;
                    auVar29._44_4_ = uVar48;
                    auVar29._48_4_ = uVar48;
                    auVar29._52_4_ = uVar48;
                    auVar29._56_4_ = uVar48;
                    auVar29._60_4_ = uVar48;
                    auVar72 = vfmadd213ps_avx512f(auVar72,auVar80,auVar29);
                    auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar46 + 0x120 + uVar56 * 4)));
                    uVar48 = *(undefined4 *)(uVar46 + 0x60 + uVar56 * 4);
                    auVar30._4_4_ = uVar48;
                    auVar30._0_4_ = uVar48;
                    auVar30._8_4_ = uVar48;
                    auVar30._12_4_ = uVar48;
                    auVar30._16_4_ = uVar48;
                    auVar30._20_4_ = uVar48;
                    auVar30._24_4_ = uVar48;
                    auVar30._28_4_ = uVar48;
                    auVar30._32_4_ = uVar48;
                    auVar30._36_4_ = uVar48;
                    auVar30._40_4_ = uVar48;
                    auVar30._44_4_ = uVar48;
                    auVar30._48_4_ = uVar48;
                    auVar30._52_4_ = uVar48;
                    auVar30._56_4_ = uVar48;
                    auVar30._60_4_ = uVar48;
                    auVar73 = vfmadd213ps_avx512f(auVar73,auVar80,auVar30);
                    auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar46 + 0x160 + uVar56 * 4)));
                    uVar48 = *(undefined4 *)(uVar46 + 0xa0 + uVar56 * 4);
                    auVar31._4_4_ = uVar48;
                    auVar31._0_4_ = uVar48;
                    auVar31._8_4_ = uVar48;
                    auVar31._12_4_ = uVar48;
                    auVar31._16_4_ = uVar48;
                    auVar31._20_4_ = uVar48;
                    auVar31._24_4_ = uVar48;
                    auVar31._28_4_ = uVar48;
                    auVar31._32_4_ = uVar48;
                    auVar31._36_4_ = uVar48;
                    auVar31._40_4_ = uVar48;
                    auVar31._44_4_ = uVar48;
                    auVar31._48_4_ = uVar48;
                    auVar31._52_4_ = uVar48;
                    auVar31._56_4_ = uVar48;
                    auVar31._60_4_ = uVar48;
                    auVar74 = vfmadd213ps_avx512f(auVar74,auVar80,auVar31);
                    auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar46 + 0x1a0 + uVar56 * 4)));
                    uVar48 = *(undefined4 *)(uVar46 + 0xe0 + uVar56 * 4);
                    auVar32._4_4_ = uVar48;
                    auVar32._0_4_ = uVar48;
                    auVar32._8_4_ = uVar48;
                    auVar32._12_4_ = uVar48;
                    auVar32._16_4_ = uVar48;
                    auVar32._20_4_ = uVar48;
                    auVar32._24_4_ = uVar48;
                    auVar32._28_4_ = uVar48;
                    auVar32._32_4_ = uVar48;
                    auVar32._36_4_ = uVar48;
                    auVar32._40_4_ = uVar48;
                    auVar32._44_4_ = uVar48;
                    auVar32._48_4_ = uVar48;
                    auVar32._52_4_ = uVar48;
                    auVar32._56_4_ = uVar48;
                    auVar32._60_4_ = uVar48;
                    auVar75 = vfmadd213ps_avx512f(auVar75,auVar80,auVar32);
                    auVar37._8_8_ = local_a2c0._8_8_;
                    auVar37._0_8_ = local_a2c0._0_8_;
                    auVar37._16_8_ = local_a2c0._16_8_;
                    auVar37._24_8_ = local_a2c0._24_8_;
                    auVar37._32_8_ = local_a2c0._32_8_;
                    auVar37._40_8_ = local_a2c0._40_8_;
                    auVar37._48_8_ = local_a2c0._48_8_;
                    auVar37._56_8_ = local_a2c0._56_8_;
                    auVar38._8_8_ = local_a2c0._72_8_;
                    auVar38._0_8_ = local_a2c0._64_8_;
                    auVar38._16_8_ = local_a2c0._80_8_;
                    auVar38._24_8_ = local_a2c0._88_8_;
                    auVar38._32_8_ = local_a2c0._96_8_;
                    auVar38._40_8_ = local_a2c0._104_8_;
                    auVar38._48_8_ = local_a2c0._112_8_;
                    auVar38._56_8_ = local_a2c0._120_8_;
                    auVar39._8_8_ = local_a2c0._136_8_;
                    auVar39._0_8_ = local_a2c0._128_8_;
                    auVar39._16_8_ = local_a2c0._144_8_;
                    auVar39._24_8_ = local_a2c0._152_8_;
                    auVar39._32_8_ = local_a2c0._160_8_;
                    auVar39._40_8_ = local_a2c0._168_8_;
                    auVar39._48_8_ = local_a2c0._176_8_;
                    auVar39._56_8_ = local_a2c0._184_8_;
                    auVar70 = vsubps_avx512f(auVar70,auVar37);
                    auVar70 = vmulps_avx512f(auVar70,local_a140);
                    auVar71 = vsubps_avx512f(auVar71,auVar38);
                    auVar71 = vmulps_avx512f(auVar71,local_a100);
                    auVar72 = vsubps_avx512f(auVar72,auVar39);
                    auVar72 = vmulps_avx512f(auVar72,local_a0c0);
                    auVar73 = vsubps_avx512f(auVar73,auVar37);
                    auVar73 = vmulps_avx512f(auVar73,local_a140);
                    auVar74 = vsubps_avx512f(auVar74,auVar38);
                    auVar74 = vmulps_avx512f(auVar74,local_a100);
                    auVar75 = vsubps_avx512f(auVar75,auVar39);
                    auVar75 = vmulps_avx512f(auVar75,local_a0c0);
                    auVar76 = vpminsd_avx512f(auVar70,auVar73);
                    auVar77 = vpminsd_avx512f(auVar71,auVar74);
                    auVar76 = vpmaxsd_avx512f(auVar76,auVar77);
                    auVar77 = vpminsd_avx512f(auVar72,auVar75);
                    auVar76 = vpmaxsd_avx512f(auVar76,auVar77);
                    auVar76 = vmulps_avx512f(auVar76,auVar63);
                    auVar70 = vpmaxsd_avx512f(auVar70,auVar73);
                    auVar71 = vpmaxsd_avx512f(auVar71,auVar74);
                    auVar70 = vpminsd_avx512f(auVar70,auVar71);
                    auVar71 = vpmaxsd_avx512f(auVar72,auVar75);
                    auVar70 = vpminsd_avx512f(auVar70,auVar71);
                    auVar70 = vmulps_avx512f(auVar70,auVar121);
                    auVar40._4_4_ = uStack_9fbc;
                    auVar40._0_4_ = local_9fc0;
                    auVar40._8_4_ = uStack_9fb8;
                    auVar40._12_4_ = uStack_9fb4;
                    auVar40._16_4_ = uStack_9fb0;
                    auVar40._20_4_ = uStack_9fac;
                    auVar40._24_4_ = uStack_9fa8;
                    auVar40._28_4_ = uStack_9fa4;
                    auVar40._32_4_ = uStack_9fa0;
                    auVar40._36_4_ = uStack_9f9c;
                    auVar40._40_4_ = uStack_9f98;
                    auVar40._44_4_ = uStack_9f94;
                    auVar40._48_4_ = uStack_9f90;
                    auVar40._52_4_ = uStack_9f8c;
                    auVar40._56_4_ = uStack_9f88;
                    auVar40._60_4_ = uStack_9f84;
                    auVar71 = vpmaxsd_avx512f(auVar76,auVar40);
                    auVar42._4_4_ = uStack_9f7c;
                    auVar42._0_4_ = local_9f80;
                    auVar42._8_4_ = uStack_9f78;
                    auVar42._12_4_ = uStack_9f74;
                    auVar42._16_4_ = uStack_9f70;
                    auVar42._20_4_ = uStack_9f6c;
                    auVar42._24_4_ = uStack_9f68;
                    auVar42._28_4_ = uStack_9f64;
                    auVar42._32_4_ = uStack_9f60;
                    auVar42._36_4_ = uStack_9f5c;
                    auVar42._40_4_ = uStack_9f58;
                    auVar42._44_4_ = uStack_9f54;
                    auVar42._48_4_ = uStack_9f50;
                    auVar42._52_4_ = uStack_9f4c;
                    auVar42._56_4_ = uStack_9f48;
                    auVar42._60_4_ = uStack_9f44;
                    auVar70 = vpminsd_avx512f(auVar70,auVar42);
                    uVar57 = vcmpps_avx512f(auVar71,auVar70,2);
                    if ((uVar44 & 7) == 6) {
                      uVar48 = *(undefined4 *)(uVar46 + 0x1c0 + uVar56 * 4);
                      auVar33._4_4_ = uVar48;
                      auVar33._0_4_ = uVar48;
                      auVar33._8_4_ = uVar48;
                      auVar33._12_4_ = uVar48;
                      auVar33._16_4_ = uVar48;
                      auVar33._20_4_ = uVar48;
                      auVar33._24_4_ = uVar48;
                      auVar33._28_4_ = uVar48;
                      auVar33._32_4_ = uVar48;
                      auVar33._36_4_ = uVar48;
                      auVar33._40_4_ = uVar48;
                      auVar33._44_4_ = uVar48;
                      auVar33._48_4_ = uVar48;
                      auVar33._52_4_ = uVar48;
                      auVar33._56_4_ = uVar48;
                      auVar33._60_4_ = uVar48;
                      uVar22 = vcmpps_avx512f(auVar80,auVar33,0xd);
                      uVar48 = *(undefined4 *)(uVar46 + 0x1e0 + uVar56 * 4);
                      auVar34._4_4_ = uVar48;
                      auVar34._0_4_ = uVar48;
                      auVar34._8_4_ = uVar48;
                      auVar34._12_4_ = uVar48;
                      auVar34._16_4_ = uVar48;
                      auVar34._20_4_ = uVar48;
                      auVar34._24_4_ = uVar48;
                      auVar34._28_4_ = uVar48;
                      auVar34._32_4_ = uVar48;
                      auVar34._36_4_ = uVar48;
                      auVar34._40_4_ = uVar48;
                      auVar34._44_4_ = uVar48;
                      auVar34._48_4_ = uVar48;
                      auVar34._52_4_ = uVar48;
                      auVar34._56_4_ = uVar48;
                      auVar34._60_4_ = uVar48;
                      uVar23 = vcmpps_avx512f(auVar80,auVar34,1);
                      uVar57 = uVar57 & uVar22 & uVar23;
                    }
                    uVar22 = vcmpps_avx512f(auVar41,local_a780,6);
                    uVar57 = uVar57 & uVar22;
                    if ((short)uVar57 != 0) {
                      auVar70 = vblendmps_avx512f(auVar67,auVar76);
                      bVar55 = (bool)((byte)uVar57 & 1);
                      auVar78._0_4_ = (uint)bVar55 * auVar70._0_4_ | (uint)!bVar55 * auVar80._0_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 1) & 1);
                      auVar78._4_4_ = (uint)bVar55 * auVar70._4_4_ | (uint)!bVar55 * auVar80._4_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 2) & 1);
                      auVar78._8_4_ = (uint)bVar55 * auVar70._8_4_ | (uint)!bVar55 * auVar80._8_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 3) & 1);
                      auVar78._12_4_ =
                           (uint)bVar55 * auVar70._12_4_ | (uint)!bVar55 * auVar80._12_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 4) & 1);
                      auVar78._16_4_ =
                           (uint)bVar55 * auVar70._16_4_ | (uint)!bVar55 * auVar80._16_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 5) & 1);
                      auVar78._20_4_ =
                           (uint)bVar55 * auVar70._20_4_ | (uint)!bVar55 * auVar80._20_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 6) & 1);
                      auVar78._24_4_ =
                           (uint)bVar55 * auVar70._24_4_ | (uint)!bVar55 * auVar80._24_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 7) & 1);
                      auVar78._28_4_ =
                           (uint)bVar55 * auVar70._28_4_ | (uint)!bVar55 * auVar80._28_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 8) & 1);
                      auVar78._32_4_ =
                           (uint)bVar55 * auVar70._32_4_ | (uint)!bVar55 * auVar80._32_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 9) & 1);
                      auVar78._36_4_ =
                           (uint)bVar55 * auVar70._36_4_ | (uint)!bVar55 * auVar80._36_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 10) & 1);
                      auVar78._40_4_ =
                           (uint)bVar55 * auVar70._40_4_ | (uint)!bVar55 * auVar80._40_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 0xb) & 1);
                      auVar78._44_4_ =
                           (uint)bVar55 * auVar70._44_4_ | (uint)!bVar55 * auVar80._44_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 0xc) & 1);
                      auVar78._48_4_ =
                           (uint)bVar55 * auVar70._48_4_ | (uint)!bVar55 * auVar80._48_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 0xd) & 1);
                      auVar78._52_4_ =
                           (uint)bVar55 * auVar70._52_4_ | (uint)!bVar55 * auVar80._52_4_;
                      bVar55 = (bool)((byte)(uVar57 >> 0xe) & 1);
                      auVar78._56_4_ =
                           (uint)bVar55 * auVar70._56_4_ | (uint)!bVar55 * auVar80._56_4_;
                      bVar55 = SUB81(uVar57 >> 0xf,0);
                      auVar78._60_4_ =
                           (uint)bVar55 * auVar70._60_4_ | (uint)!bVar55 * auVar80._60_4_;
                      root.ptr = uVar53;
                      if (uVar47 != 8) {
                        *puVar54 = uVar47;
                        puVar54 = puVar54 + 1;
                        *pauVar50 = auVar79;
                        pauVar50 = pauVar50 + 1;
                      }
                    }
                  }
                } while ((uVar53 != 8) &&
                        (bVar55 = uVar56 < 7, uVar56 = uVar56 + 1, uVar47 = root.ptr,
                        auVar79 = auVar78, bVar55));
                iVar58 = 0;
                if (root.ptr == 8) {
LAB_008e5798:
                  bVar55 = false;
                  iVar58 = 4;
                }
                else {
                  auVar43._4_4_ = uStack_9f7c;
                  auVar43._0_4_ = local_9f80;
                  auVar43._8_4_ = uStack_9f78;
                  auVar43._12_4_ = uStack_9f74;
                  auVar43._16_4_ = uStack_9f70;
                  auVar43._20_4_ = uStack_9f6c;
                  auVar43._24_4_ = uStack_9f68;
                  auVar43._28_4_ = uStack_9f64;
                  auVar43._32_4_ = uStack_9f60;
                  auVar43._36_4_ = uStack_9f5c;
                  auVar43._40_4_ = uStack_9f58;
                  auVar43._44_4_ = uStack_9f54;
                  auVar43._48_4_ = uStack_9f50;
                  auVar43._52_4_ = uStack_9f4c;
                  auVar43._56_4_ = uStack_9f48;
                  auVar43._60_4_ = uStack_9f44;
                  uVar24 = vcmpps_avx512f(auVar78,auVar43,9);
                  bVar55 = true;
                  if ((uint)POPCOUNT((int)uVar24) <= uVar52) {
                    *puVar54 = root.ptr;
                    puVar54 = puVar54 + 1;
                    *pauVar50 = auVar78;
                    pauVar50 = pauVar50 + 1;
                    goto LAB_008e5798;
                  }
                }
                local_a780 = auVar78;
              } while (bVar55);
            }
          }
        }
      } while (iVar58 != 3);
      local_a864 = local_a864 & local_a804;
      bVar55 = (bool)((byte)local_a864 & 1);
      bVar6 = (bool)((byte)(local_a864 >> 1) & 1);
      bVar7 = (bool)((byte)(local_a864 >> 2) & 1);
      bVar8 = (bool)((byte)(local_a864 >> 3) & 1);
      bVar9 = (bool)((byte)(local_a864 >> 4) & 1);
      bVar10 = (bool)((byte)(local_a864 >> 5) & 1);
      bVar11 = (bool)((byte)(local_a864 >> 6) & 1);
      bVar12 = (bool)((byte)(local_a864 >> 7) & 1);
      bVar14 = (bool)((byte)(local_a864 >> 8) & 1);
      bVar15 = (bool)((byte)(local_a864 >> 9) & 1);
      bVar16 = (bool)((byte)(local_a864 >> 10) & 1);
      bVar17 = (bool)((byte)(local_a864 >> 0xb) & 1);
      bVar18 = (bool)((byte)(local_a864 >> 0xc) & 1);
      bVar19 = (bool)((byte)(local_a864 >> 0xd) & 1);
      bVar20 = (bool)((byte)(local_a864 >> 0xe) & 1);
      bVar21 = (bool)((byte)(local_a864 >> 0xf) & 1);
      *(uint *)local_a810 = (uint)bVar55 * auVar68._0_4_ | (uint)!bVar55 * *(int *)local_a810;
      *(uint *)(local_a810 + 4) =
           (uint)bVar6 * auVar68._4_4_ | (uint)!bVar6 * *(int *)(local_a810 + 4);
      *(uint *)(local_a810 + 8) =
           (uint)bVar7 * auVar68._8_4_ | (uint)!bVar7 * *(int *)(local_a810 + 8);
      *(uint *)(local_a810 + 0xc) =
           (uint)bVar8 * auVar68._12_4_ | (uint)!bVar8 * *(int *)(local_a810 + 0xc);
      *(uint *)(local_a810 + 0x10) =
           (uint)bVar9 * auVar68._16_4_ | (uint)!bVar9 * *(int *)(local_a810 + 0x10);
      *(uint *)(local_a810 + 0x14) =
           (uint)bVar10 * auVar68._20_4_ | (uint)!bVar10 * *(int *)(local_a810 + 0x14);
      *(uint *)(local_a810 + 0x18) =
           (uint)bVar11 * auVar68._24_4_ | (uint)!bVar11 * *(int *)(local_a810 + 0x18);
      *(uint *)(local_a810 + 0x1c) =
           (uint)bVar12 * auVar68._28_4_ | (uint)!bVar12 * *(int *)(local_a810 + 0x1c);
      *(uint *)(local_a810 + 0x20) =
           (uint)bVar14 * auVar68._32_4_ | (uint)!bVar14 * *(int *)(local_a810 + 0x20);
      *(uint *)(local_a810 + 0x24) =
           (uint)bVar15 * auVar68._36_4_ | (uint)!bVar15 * *(int *)(local_a810 + 0x24);
      *(uint *)(local_a810 + 0x28) =
           (uint)bVar16 * auVar68._40_4_ | (uint)!bVar16 * *(int *)(local_a810 + 0x28);
      *(uint *)(local_a810 + 0x2c) =
           (uint)bVar17 * auVar68._44_4_ | (uint)!bVar17 * *(int *)(local_a810 + 0x2c);
      *(uint *)(local_a810 + 0x30) =
           (uint)bVar18 * auVar68._48_4_ | (uint)!bVar18 * *(int *)(local_a810 + 0x30);
      *(uint *)(local_a810 + 0x34) =
           (uint)bVar19 * auVar68._52_4_ | (uint)!bVar19 * *(int *)(local_a810 + 0x34);
      *(uint *)(local_a810 + 0x38) =
           (uint)bVar20 * auVar68._56_4_ | (uint)!bVar20 * *(int *)(local_a810 + 0x38);
      *(uint *)(local_a810 + 0x3c) =
           (uint)bVar21 * auVar68._60_4_ | (uint)!bVar21 * *(int *)(local_a810 + 0x3c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }